

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx::CurveNiIntersectorK<4,8>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  Primitive PVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  void *pvVar12;
  __int_type_conflict _Var13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  bool bVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  uint uVar62;
  uint uVar63;
  ulong uVar64;
  long lVar65;
  uint uVar66;
  long lVar67;
  uint uVar69;
  ulong uVar70;
  ulong uVar71;
  vint4 bi_2;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar76 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  float fVar86;
  float fVar107;
  vint4 bi_1;
  undefined1 auVar88 [16];
  float fVar87;
  float fVar108;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  vint4 ai;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar115 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar124;
  float fVar142;
  float fVar143;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar144;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  vint4 bi;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar160;
  float fVar177;
  float fVar178;
  vint4 ai_2;
  undefined1 auVar161 [16];
  float fVar179;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar180;
  float fVar193;
  float fVar194;
  undefined1 auVar181 [16];
  float fVar195;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar186 [16];
  float fVar196;
  undefined1 auVar192 [32];
  vfloat4 b0;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  vint4 ai_1;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  float pp;
  float fVar238;
  float fVar247;
  float fVar248;
  float fVar249;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [32];
  float fVar250;
  float fVar258;
  float fVar259;
  vfloat4 a0_1;
  float fVar260;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar261;
  float fVar266;
  float fVar268;
  undefined1 auVar262 [16];
  float fVar270;
  undefined1 auVar263 [16];
  float fVar267;
  float fVar269;
  float fVar271;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar286;
  float fVar287;
  undefined1 auVar280 [16];
  float fVar288;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  float fVar289;
  float fVar290;
  undefined1 auVar285 [32];
  float fVar291;
  float fVar292;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  vfloat4 a0;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar306 [64];
  vfloat_impl<4> p03;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_700 [16];
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  undefined1 local_620 [16];
  float local_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float local_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  RTCFilterFunctionNArguments local_4f0;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  uint auStack_450 [4];
  undefined1 local_440 [16];
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [8];
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  undefined1 local_3f0 [8];
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  undefined1 local_330 [8];
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  float afStack_300 [8];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 auStack_170 [16];
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar68;
  undefined1 auVar141 [32];
  undefined1 auVar305 [32];
  
  PVar9 = prim[1];
  uVar71 = (ulong)(byte)PVar9;
  auVar95 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar95 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar160 = *(float *)(prim + uVar71 * 0x19 + 0x12);
  auVar95 = vsubps_avx(auVar95,*(undefined1 (*) [16])(prim + uVar71 * 0x19 + 6));
  auVar109._0_4_ = fVar160 * auVar95._0_4_;
  auVar109._4_4_ = fVar160 * auVar95._4_4_;
  auVar109._8_4_ = fVar160 * auVar95._8_4_;
  auVar109._12_4_ = fVar160 * auVar95._12_4_;
  auVar197._0_4_ = fVar160 * auVar15._0_4_;
  auVar197._4_4_ = fVar160 * auVar15._4_4_;
  auVar197._8_4_ = fVar160 * auVar15._8_4_;
  auVar197._12_4_ = fVar160 * auVar15._12_4_;
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 4 + 6)));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 5 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 6 + 6)));
  auVar175 = vcvtdq2ps_avx(auVar175);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0xb + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar9 * 0xc + uVar71 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  uVar64 = (ulong)(uint)((int)(uVar71 * 9) * 2);
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 + 6)));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 + uVar71 + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  uVar64 = (ulong)(uint)((int)(uVar71 * 5) << 2);
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 + 6)));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar72 = vshufps_avx(auVar197,auVar197,0);
  auVar77 = vshufps_avx(auVar197,auVar197,0x55);
  auVar116 = vshufps_avx(auVar197,auVar197,0xaa);
  fVar160 = auVar116._0_4_;
  fVar124 = auVar116._4_4_;
  fVar177 = auVar116._8_4_;
  fVar142 = auVar116._12_4_;
  fVar180 = auVar77._0_4_;
  fVar193 = auVar77._4_4_;
  fVar194 = auVar77._8_4_;
  fVar195 = auVar77._12_4_;
  fVar178 = auVar72._0_4_;
  fVar143 = auVar72._4_4_;
  fVar179 = auVar72._8_4_;
  fVar144 = auVar72._12_4_;
  auVar262._0_4_ = fVar178 * auVar95._0_4_ + fVar180 * auVar15._0_4_ + fVar160 * auVar175._0_4_;
  auVar262._4_4_ = fVar143 * auVar95._4_4_ + fVar193 * auVar15._4_4_ + fVar124 * auVar175._4_4_;
  auVar262._8_4_ = fVar179 * auVar95._8_4_ + fVar194 * auVar15._8_4_ + fVar177 * auVar175._8_4_;
  auVar262._12_4_ = fVar144 * auVar95._12_4_ + fVar195 * auVar15._12_4_ + fVar142 * auVar175._12_4_;
  auVar280._0_4_ = fVar178 * auVar16._0_4_ + fVar180 * auVar17._0_4_ + auVar18._0_4_ * fVar160;
  auVar280._4_4_ = fVar143 * auVar16._4_4_ + fVar193 * auVar17._4_4_ + auVar18._4_4_ * fVar124;
  auVar280._8_4_ = fVar179 * auVar16._8_4_ + fVar194 * auVar17._8_4_ + auVar18._8_4_ * fVar177;
  auVar280._12_4_ = fVar144 * auVar16._12_4_ + fVar195 * auVar17._12_4_ + auVar18._12_4_ * fVar142;
  auVar198._0_4_ = fVar178 * auVar73._0_4_ + fVar180 * auVar74._0_4_ + auVar94._0_4_ * fVar160;
  auVar198._4_4_ = fVar143 * auVar73._4_4_ + fVar193 * auVar74._4_4_ + auVar94._4_4_ * fVar124;
  auVar198._8_4_ = fVar179 * auVar73._8_4_ + fVar194 * auVar74._8_4_ + auVar94._8_4_ * fVar177;
  auVar198._12_4_ = fVar144 * auVar73._12_4_ + fVar195 * auVar74._12_4_ + auVar94._12_4_ * fVar142;
  auVar72 = vshufps_avx(auVar109,auVar109,0);
  auVar77 = vshufps_avx(auVar109,auVar109,0x55);
  auVar116 = vshufps_avx(auVar109,auVar109,0xaa);
  fVar160 = auVar116._0_4_;
  fVar124 = auVar116._4_4_;
  fVar177 = auVar116._8_4_;
  fVar142 = auVar116._12_4_;
  fVar180 = auVar77._0_4_;
  fVar193 = auVar77._4_4_;
  fVar194 = auVar77._8_4_;
  fVar195 = auVar77._12_4_;
  fVar178 = auVar72._0_4_;
  fVar143 = auVar72._4_4_;
  fVar179 = auVar72._8_4_;
  fVar144 = auVar72._12_4_;
  auVar145._0_4_ = fVar178 * auVar95._0_4_ + fVar180 * auVar15._0_4_ + fVar160 * auVar175._0_4_;
  auVar145._4_4_ = fVar143 * auVar95._4_4_ + fVar193 * auVar15._4_4_ + fVar124 * auVar175._4_4_;
  auVar145._8_4_ = fVar179 * auVar95._8_4_ + fVar194 * auVar15._8_4_ + fVar177 * auVar175._8_4_;
  auVar145._12_4_ = fVar144 * auVar95._12_4_ + fVar195 * auVar15._12_4_ + fVar142 * auVar175._12_4_;
  auVar77._0_4_ = fVar178 * auVar16._0_4_ + auVar18._0_4_ * fVar160 + fVar180 * auVar17._0_4_;
  auVar77._4_4_ = fVar143 * auVar16._4_4_ + auVar18._4_4_ * fVar124 + fVar193 * auVar17._4_4_;
  auVar77._8_4_ = fVar179 * auVar16._8_4_ + auVar18._8_4_ * fVar177 + fVar194 * auVar17._8_4_;
  auVar77._12_4_ = fVar144 * auVar16._12_4_ + auVar18._12_4_ * fVar142 + fVar195 * auVar17._12_4_;
  auVar72._0_4_ = fVar178 * auVar73._0_4_ + fVar180 * auVar74._0_4_ + auVar94._0_4_ * fVar160;
  auVar72._4_4_ = fVar143 * auVar73._4_4_ + fVar193 * auVar74._4_4_ + auVar94._4_4_ * fVar124;
  auVar72._8_4_ = fVar179 * auVar73._8_4_ + fVar194 * auVar74._8_4_ + auVar94._8_4_ * fVar177;
  auVar72._12_4_ = fVar144 * auVar73._12_4_ + fVar195 * auVar74._12_4_ + auVar94._12_4_ * fVar142;
  auVar181._8_4_ = 0x7fffffff;
  auVar181._0_8_ = 0x7fffffff7fffffff;
  auVar181._12_4_ = 0x7fffffff;
  auVar95 = vandps_avx(auVar262,auVar181);
  auVar125._8_4_ = 0x219392ef;
  auVar125._0_8_ = 0x219392ef219392ef;
  auVar125._12_4_ = 0x219392ef;
  auVar95 = vcmpps_avx(auVar95,auVar125,1);
  auVar15 = vblendvps_avx(auVar262,auVar125,auVar95);
  auVar95 = vandps_avx(auVar280,auVar181);
  auVar95 = vcmpps_avx(auVar95,auVar125,1);
  auVar175 = vblendvps_avx(auVar280,auVar125,auVar95);
  auVar95 = vandps_avx(auVar198,auVar181);
  auVar95 = vcmpps_avx(auVar95,auVar125,1);
  auVar95 = vblendvps_avx(auVar198,auVar125,auVar95);
  auVar16 = vrcpps_avx(auVar15);
  fVar180 = auVar16._0_4_;
  auVar116._0_4_ = fVar180 * auVar15._0_4_;
  fVar193 = auVar16._4_4_;
  auVar116._4_4_ = fVar193 * auVar15._4_4_;
  fVar194 = auVar16._8_4_;
  auVar116._8_4_ = fVar194 * auVar15._8_4_;
  fVar195 = auVar16._12_4_;
  auVar116._12_4_ = fVar195 * auVar15._12_4_;
  auVar199._8_4_ = 0x3f800000;
  auVar199._0_8_ = &DAT_3f8000003f800000;
  auVar199._12_4_ = 0x3f800000;
  auVar15 = vsubps_avx(auVar199,auVar116);
  fVar180 = fVar180 + fVar180 * auVar15._0_4_;
  fVar193 = fVar193 + fVar193 * auVar15._4_4_;
  fVar194 = fVar194 + fVar194 * auVar15._8_4_;
  fVar195 = fVar195 + fVar195 * auVar15._12_4_;
  auVar15 = vrcpps_avx(auVar175);
  fVar160 = auVar15._0_4_;
  auVar161._0_4_ = fVar160 * auVar175._0_4_;
  fVar177 = auVar15._4_4_;
  auVar161._4_4_ = fVar177 * auVar175._4_4_;
  fVar178 = auVar15._8_4_;
  auVar161._8_4_ = fVar178 * auVar175._8_4_;
  fVar179 = auVar15._12_4_;
  auVar161._12_4_ = fVar179 * auVar175._12_4_;
  auVar15 = vsubps_avx(auVar199,auVar161);
  fVar160 = fVar160 + fVar160 * auVar15._0_4_;
  fVar177 = fVar177 + fVar177 * auVar15._4_4_;
  fVar178 = fVar178 + fVar178 * auVar15._8_4_;
  fVar179 = fVar179 + fVar179 * auVar15._12_4_;
  auVar15 = vrcpps_avx(auVar95);
  fVar124 = auVar15._0_4_;
  auVar126._0_4_ = fVar124 * auVar95._0_4_;
  fVar142 = auVar15._4_4_;
  auVar126._4_4_ = fVar142 * auVar95._4_4_;
  fVar143 = auVar15._8_4_;
  auVar126._8_4_ = fVar143 * auVar95._8_4_;
  fVar144 = auVar15._12_4_;
  auVar126._12_4_ = fVar144 * auVar95._12_4_;
  auVar95 = vsubps_avx(auVar199,auVar126);
  fVar124 = fVar124 + fVar124 * auVar95._0_4_;
  fVar142 = fVar142 + fVar142 * auVar95._4_4_;
  fVar143 = fVar143 + fVar143 * auVar95._8_4_;
  fVar144 = fVar144 + fVar144 * auVar95._12_4_;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar71 * 7 + 6);
  auVar95 = vpmovsxwd_avx(auVar95);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar145);
  auVar110._0_4_ = fVar180 * auVar95._0_4_;
  auVar110._4_4_ = fVar193 * auVar95._4_4_;
  auVar110._8_4_ = fVar194 * auVar95._8_4_;
  auVar110._12_4_ = fVar195 * auVar95._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar71 * 9 + 6);
  auVar95 = vpmovsxwd_avx(auVar15);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar145);
  auVar146._0_4_ = fVar180 * auVar95._0_4_;
  auVar146._4_4_ = fVar193 * auVar95._4_4_;
  auVar146._8_4_ = fVar194 * auVar95._8_4_;
  auVar146._12_4_ = fVar195 * auVar95._12_4_;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 6);
  auVar15 = vpmovsxwd_avx(auVar175);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + uVar71 * -2 + 6);
  auVar95 = vpmovsxwd_avx(auVar16);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar77);
  auVar210._0_4_ = auVar95._0_4_ * fVar160;
  auVar210._4_4_ = auVar95._4_4_ * fVar177;
  auVar210._8_4_ = auVar95._8_4_ * fVar178;
  auVar210._12_4_ = auVar95._12_4_ * fVar179;
  auVar95 = vcvtdq2ps_avx(auVar15);
  auVar95 = vsubps_avx(auVar95,auVar77);
  auVar94._0_4_ = fVar160 * auVar95._0_4_;
  auVar94._4_4_ = fVar177 * auVar95._4_4_;
  auVar94._8_4_ = fVar178 * auVar95._8_4_;
  auVar94._12_4_ = fVar179 * auVar95._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar64 + uVar71 + 6);
  auVar95 = vpmovsxwd_avx(auVar17);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar72);
  auVar162._0_4_ = auVar95._0_4_ * fVar124;
  auVar162._4_4_ = auVar95._4_4_ * fVar142;
  auVar162._8_4_ = auVar95._8_4_ * fVar143;
  auVar162._12_4_ = auVar95._12_4_ * fVar144;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar71 * 0x17 + 6);
  auVar95 = vpmovsxwd_avx(auVar18);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar72);
  auVar73._0_4_ = auVar95._0_4_ * fVar124;
  auVar73._4_4_ = auVar95._4_4_ * fVar142;
  auVar73._8_4_ = auVar95._8_4_ * fVar143;
  auVar73._12_4_ = auVar95._12_4_ * fVar144;
  auVar95 = vpminsd_avx(auVar110,auVar146);
  auVar15 = vpminsd_avx(auVar210,auVar94);
  auVar95 = vmaxps_avx(auVar95,auVar15);
  auVar15 = vpminsd_avx(auVar162,auVar73);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar223._4_4_ = uVar6;
  auVar223._0_4_ = uVar6;
  auVar223._8_4_ = uVar6;
  auVar223._12_4_ = uVar6;
  auVar15 = vmaxps_avx(auVar15,auVar223);
  auVar95 = vmaxps_avx(auVar95,auVar15);
  local_440._0_4_ = auVar95._0_4_ * 0.99999964;
  local_440._4_4_ = auVar95._4_4_ * 0.99999964;
  local_440._8_4_ = auVar95._8_4_ * 0.99999964;
  local_440._12_4_ = auVar95._12_4_ * 0.99999964;
  auVar95 = vpmaxsd_avx(auVar110,auVar146);
  auVar15 = vpmaxsd_avx(auVar210,auVar94);
  auVar95 = vminps_avx(auVar95,auVar15);
  auVar15 = vpmaxsd_avx(auVar162,auVar73);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar111._4_4_ = uVar6;
  auVar111._0_4_ = uVar6;
  auVar111._8_4_ = uVar6;
  auVar111._12_4_ = uVar6;
  auVar15 = vminps_avx(auVar15,auVar111);
  auVar95 = vminps_avx(auVar95,auVar15);
  auVar74._0_4_ = auVar95._0_4_ * 1.0000004;
  auVar74._4_4_ = auVar95._4_4_ * 1.0000004;
  auVar74._8_4_ = auVar95._8_4_ * 1.0000004;
  auVar74._12_4_ = auVar95._12_4_ * 1.0000004;
  auVar95 = vpshufd_avx(ZEXT116((byte)PVar9),0);
  auVar15 = vpcmpgtd_avx(auVar95,_DAT_01ff0cf0);
  auVar95 = vcmpps_avx(local_440,auVar74,2);
  auVar95 = vandps_avx(auVar95,auVar15);
  uVar62 = vmovmskps_avx(auVar95);
  if (uVar62 == 0) {
    return;
  }
  uVar62 = uVar62 & 0xff;
  auVar80._16_16_ = mm_lookupmask_ps._240_16_;
  auVar80._0_16_ = mm_lookupmask_ps._240_16_;
  local_320 = vblendps_avx(auVar80,ZEXT832(0) << 0x20,0x80);
  uVar69 = 1 << ((byte)k & 0x1f);
  uVar64 = (ulong)((uVar69 & 0xf) << 4);
  lVar67 = (long)((int)uVar69 >> 4) * 0x10;
  auVar306 = ZEXT464(0) << 0x20;
LAB_00ee4be5:
  uVar71 = (ulong)uVar62;
  lVar65 = 0;
  if (uVar71 != 0) {
    for (; (uVar62 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
    }
  }
  uVar62 = *(uint *)(prim + 2);
  uVar69 = *(uint *)(prim + lVar65 * 4 + 6);
  pGVar10 = (context->scene->geometries).items[uVar62].ptr;
  uVar70 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                           pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar69);
  p_Var11 = pGVar10[1].intersectionFilterN;
  pvVar12 = pGVar10[2].userPtr;
  _Var13 = pGVar10[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var13 + uVar70 * (long)pvVar12);
  fVar160 = *pfVar1;
  fVar124 = pfVar1[1];
  fVar177 = pfVar1[2];
  fVar142 = pfVar1[3];
  pfVar1 = (float *)(_Var13 + (uVar70 + 1) * (long)pvVar12);
  pfVar2 = (float *)(_Var13 + (uVar70 + 2) * (long)pvVar12);
  pfVar3 = (float *)(_Var13 + (long)pvVar12 * (uVar70 + 3));
  fVar178 = *pfVar3;
  fVar143 = pfVar3[1];
  fVar179 = pfVar3[2];
  fVar144 = pfVar3[3];
  uVar71 = uVar71 - 1 & uVar71;
  lVar65 = *(long *)&pGVar10[1].time_range.upper;
  pfVar3 = (float *)(lVar65 + (long)p_Var11 * uVar70);
  fVar180 = *pfVar3;
  fVar193 = pfVar3[1];
  fVar194 = pfVar3[2];
  fVar195 = pfVar3[3];
  pfVar3 = (float *)(lVar65 + (long)p_Var11 * (uVar70 + 1));
  pfVar4 = (float *)(lVar65 + (long)p_Var11 * (uVar70 + 2));
  lVar14 = 0;
  if (uVar71 != 0) {
    for (; (uVar71 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
    }
  }
  pfVar5 = (float *)(lVar65 + (long)p_Var11 * (uVar70 + 3));
  fVar86 = *pfVar5;
  fVar87 = pfVar5[1];
  fVar107 = pfVar5[2];
  fVar108 = pfVar5[3];
  if (((uVar71 != 0) && (uVar70 = uVar71 - 1 & uVar71, uVar70 != 0)) && (lVar65 = 0, uVar70 != 0)) {
    for (; (uVar70 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
    }
  }
  auVar95 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar16 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar298 = auVar306._8_4_;
  fVar300 = auVar306._12_4_;
  fVar238 = *pfVar4 * 0.0;
  fVar247 = pfVar4[1] * 0.0;
  fVar248 = fVar298 * pfVar4[2];
  fVar249 = fVar300 * pfVar4[3];
  fVar250 = fVar238 + fVar86 * 0.0;
  fVar258 = fVar247 + fVar87 * 0.0;
  fVar259 = fVar248 + fVar107 * fVar298;
  fVar260 = fVar249 + fVar108 * fVar300;
  fVar261 = *pfVar3 * 0.0;
  fVar266 = pfVar3[1] * 0.0;
  fVar268 = fVar298 * pfVar3[2];
  fVar270 = fVar300 * pfVar3[3];
  local_680._0_4_ = fVar180 + fVar261 + fVar250;
  local_680._4_4_ = fVar193 + fVar266 + fVar258;
  fStack_678 = fVar194 + fVar268 + fVar259;
  fStack_674 = fVar195 + fVar270 + fVar260;
  auVar112._0_4_ = fVar250 + *pfVar3 * 3.0;
  auVar112._4_4_ = fVar258 + pfVar3[1] * 3.0;
  auVar112._8_4_ = fVar259 + pfVar3[2] * 3.0;
  auVar112._12_4_ = fVar260 + pfVar3[3] * 3.0;
  auVar251._0_4_ = fVar180 * 3.0;
  auVar251._4_4_ = fVar193 * 3.0;
  auVar251._8_4_ = fVar194 * 3.0;
  auVar251._12_4_ = fVar195 * 3.0;
  auVar77 = vsubps_avx(auVar112,auVar251);
  fVar279 = *pfVar2 * 0.0;
  fVar286 = pfVar2[1] * 0.0;
  fVar287 = pfVar2[2] * fVar298;
  fVar288 = pfVar2[3] * fVar300;
  fVar250 = fVar279 + fVar178 * 0.0;
  fVar258 = fVar286 + fVar143 * 0.0;
  fVar259 = fVar287 + fVar298 * fVar179;
  fVar260 = fVar288 + fVar300 * fVar144;
  fVar291 = *pfVar1 * 0.0;
  fVar296 = pfVar1[1] * 0.0;
  fVar298 = fVar298 * pfVar1[2];
  fVar300 = fVar300 * pfVar1[3];
  auVar301._0_4_ = fVar291 + fVar250 + fVar160;
  auVar301._4_4_ = fVar296 + fVar258 + fVar124;
  auVar301._8_4_ = fVar298 + fVar259 + fVar177;
  auVar301._12_4_ = fVar300 + fVar260 + fVar142;
  auVar127._0_4_ = fVar250 + *pfVar1 * 3.0;
  auVar127._4_4_ = fVar258 + pfVar1[1] * 3.0;
  auVar127._8_4_ = fVar259 + pfVar1[2] * 3.0;
  auVar127._12_4_ = fVar260 + pfVar1[3] * 3.0;
  auVar252._0_4_ = fVar160 * 3.0;
  auVar252._4_4_ = fVar124 * 3.0;
  auVar252._8_4_ = fVar177 * 3.0;
  auVar252._12_4_ = fVar142 * 3.0;
  auVar17 = vsubps_avx(auVar127,auVar252);
  auVar211._0_4_ = fVar180 * 0.0;
  auVar211._4_4_ = fVar193 * 0.0;
  auVar211._8_4_ = fVar194 * 0.0;
  auVar211._12_4_ = fVar195 * 0.0;
  auVar128._0_4_ = auVar211._0_4_ + fVar261 + fVar238 + fVar86;
  auVar128._4_4_ = auVar211._4_4_ + fVar266 + fVar247 + fVar87;
  auVar128._8_4_ = auVar211._8_4_ + fVar268 + fVar248 + fVar107;
  auVar128._12_4_ = auVar211._12_4_ + fVar270 + fVar249 + fVar108;
  auVar224._0_4_ = fVar86 * 3.0;
  auVar224._4_4_ = fVar87 * 3.0;
  auVar224._8_4_ = fVar107 * 3.0;
  auVar224._12_4_ = fVar108 * 3.0;
  auVar147._0_4_ = *pfVar4 * 3.0;
  auVar147._4_4_ = pfVar4[1] * 3.0;
  auVar147._8_4_ = pfVar4[2] * 3.0;
  auVar147._12_4_ = pfVar4[3] * 3.0;
  auVar95 = vsubps_avx(auVar224,auVar147);
  auVar148._0_4_ = fVar261 + auVar95._0_4_;
  auVar148._4_4_ = fVar266 + auVar95._4_4_;
  auVar148._8_4_ = fVar268 + auVar95._8_4_;
  auVar148._12_4_ = fVar270 + auVar95._12_4_;
  auVar116 = vsubps_avx(auVar148,auVar211);
  auVar163._0_4_ = fVar160 * 0.0;
  auVar163._4_4_ = fVar124 * 0.0;
  auVar163._8_4_ = fVar177 * 0.0;
  auVar163._12_4_ = fVar142 * 0.0;
  auVar225._0_4_ = fVar291 + fVar279 + fVar178 + auVar163._0_4_;
  auVar225._4_4_ = fVar296 + fVar286 + fVar143 + auVar163._4_4_;
  auVar225._8_4_ = fVar298 + fVar287 + fVar179 + auVar163._8_4_;
  auVar225._12_4_ = fVar300 + fVar288 + fVar144 + auVar163._12_4_;
  auVar200._0_4_ = fVar178 * 3.0;
  auVar200._4_4_ = fVar143 * 3.0;
  auVar200._8_4_ = fVar179 * 3.0;
  auVar200._12_4_ = fVar144 * 3.0;
  auVar182._0_4_ = *pfVar2 * 3.0;
  auVar182._4_4_ = pfVar2[1] * 3.0;
  auVar182._8_4_ = pfVar2[2] * 3.0;
  auVar182._12_4_ = pfVar2[3] * 3.0;
  auVar95 = vsubps_avx(auVar200,auVar182);
  auVar183._0_4_ = fVar291 + auVar95._0_4_;
  auVar183._4_4_ = fVar296 + auVar95._4_4_;
  auVar183._8_4_ = fVar298 + auVar95._8_4_;
  auVar183._12_4_ = fVar300 + auVar95._12_4_;
  auVar73 = vsubps_avx(auVar183,auVar163);
  auVar95 = vshufps_avx(auVar77,auVar77,0xc9);
  auVar15 = vshufps_avx(auVar301,auVar301,0xc9);
  fVar298 = auVar77._0_4_;
  auVar201._0_4_ = fVar298 * auVar15._0_4_;
  fVar300 = auVar77._4_4_;
  auVar201._4_4_ = fVar300 * auVar15._4_4_;
  fVar238 = auVar77._8_4_;
  auVar201._8_4_ = fVar238 * auVar15._8_4_;
  fVar247 = auVar77._12_4_;
  auVar201._12_4_ = fVar247 * auVar15._12_4_;
  auVar212._0_4_ = auVar301._0_4_ * auVar95._0_4_;
  auVar212._4_4_ = auVar301._4_4_ * auVar95._4_4_;
  auVar212._8_4_ = auVar301._8_4_ * auVar95._8_4_;
  auVar212._12_4_ = auVar301._12_4_ * auVar95._12_4_;
  auVar15 = vsubps_avx(auVar212,auVar201);
  auVar175 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar15 = vshufps_avx(auVar17,auVar17,0xc9);
  auVar202._0_4_ = fVar298 * auVar15._0_4_;
  auVar202._4_4_ = fVar300 * auVar15._4_4_;
  auVar202._8_4_ = fVar238 * auVar15._8_4_;
  auVar202._12_4_ = fVar247 * auVar15._12_4_;
  auVar164._0_4_ = auVar17._0_4_ * auVar95._0_4_;
  auVar164._4_4_ = auVar17._4_4_ * auVar95._4_4_;
  auVar164._8_4_ = auVar17._8_4_ * auVar95._8_4_;
  auVar164._12_4_ = auVar17._12_4_ * auVar95._12_4_;
  auVar95 = vsubps_avx(auVar164,auVar202);
  auVar17 = vshufps_avx(auVar95,auVar95,0xc9);
  auVar95 = vshufps_avx(auVar116,auVar116,0xc9);
  auVar15 = vshufps_avx(auVar225,auVar225,0xc9);
  fVar248 = auVar116._0_4_;
  auVar165._0_4_ = fVar248 * auVar15._0_4_;
  fVar249 = auVar116._4_4_;
  auVar165._4_4_ = fVar249 * auVar15._4_4_;
  fVar250 = auVar116._8_4_;
  auVar165._8_4_ = fVar250 * auVar15._8_4_;
  fVar258 = auVar116._12_4_;
  auVar165._12_4_ = fVar258 * auVar15._12_4_;
  auVar226._0_4_ = auVar225._0_4_ * auVar95._0_4_;
  auVar226._4_4_ = auVar225._4_4_ * auVar95._4_4_;
  auVar226._8_4_ = auVar225._8_4_ * auVar95._8_4_;
  auVar226._12_4_ = auVar225._12_4_ * auVar95._12_4_;
  auVar15 = vsubps_avx(auVar226,auVar165);
  auVar18 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar15 = vshufps_avx(auVar73,auVar73,0xc9);
  auVar227._0_4_ = auVar15._0_4_ * fVar248;
  auVar227._4_4_ = auVar15._4_4_ * fVar249;
  auVar227._8_4_ = auVar15._8_4_ * fVar250;
  auVar227._12_4_ = auVar15._12_4_ * fVar258;
  auVar184._0_4_ = auVar95._0_4_ * auVar73._0_4_;
  auVar184._4_4_ = auVar95._4_4_ * auVar73._4_4_;
  auVar184._8_4_ = auVar95._8_4_ * auVar73._8_4_;
  auVar184._12_4_ = auVar95._12_4_ * auVar73._12_4_;
  auVar95 = vsubps_avx(auVar184,auVar227);
  auVar73 = vshufps_avx(auVar95,auVar95,0xc9);
  auVar95 = vdpps_avx(auVar175,auVar175,0x7f);
  fVar178 = auVar95._0_4_;
  auVar94 = ZEXT416((uint)fVar178);
  auVar15 = vrsqrtss_avx(auVar94,auVar94);
  fVar160 = auVar15._0_4_;
  auVar15 = vdpps_avx(auVar175,auVar17,0x7f);
  auVar74 = ZEXT416((uint)(fVar160 * 1.5 - fVar178 * 0.5 * fVar160 * fVar160 * fVar160));
  auVar74 = vshufps_avx(auVar74,auVar74,0);
  fVar160 = auVar175._0_4_ * auVar74._0_4_;
  fVar124 = auVar175._4_4_ * auVar74._4_4_;
  fVar177 = auVar175._8_4_ * auVar74._8_4_;
  fVar142 = auVar175._12_4_ * auVar74._12_4_;
  auVar95 = vshufps_avx(auVar95,auVar95,0);
  auVar239._0_4_ = auVar17._0_4_ * auVar95._0_4_;
  auVar239._4_4_ = auVar17._4_4_ * auVar95._4_4_;
  auVar239._8_4_ = auVar17._8_4_ * auVar95._8_4_;
  auVar239._12_4_ = auVar17._12_4_ * auVar95._12_4_;
  auVar95 = vshufps_avx(auVar15,auVar15,0);
  auVar213._0_4_ = auVar175._0_4_ * auVar95._0_4_;
  auVar213._4_4_ = auVar175._4_4_ * auVar95._4_4_;
  auVar213._8_4_ = auVar175._8_4_ * auVar95._8_4_;
  auVar213._12_4_ = auVar175._12_4_ * auVar95._12_4_;
  auVar109 = vsubps_avx(auVar239,auVar213);
  auVar95 = vrcpss_avx(auVar94,auVar94);
  auVar95 = ZEXT416((uint)(auVar95._0_4_ * (2.0 - fVar178 * auVar95._0_4_)));
  auVar17 = vshufps_avx(auVar95,auVar95,0);
  auVar15 = vdpps_avx(auVar18,auVar18,0x7f);
  auVar95 = vblendps_avx(auVar15,_DAT_01feba10,0xe);
  auVar175 = vrsqrtss_avx(auVar95,auVar95);
  fVar178 = auVar175._0_4_;
  auVar175 = ZEXT416((uint)(fVar178 * 1.5 - auVar15._0_4_ * 0.5 * fVar178 * fVar178 * fVar178));
  auVar94 = vshufps_avx(auVar175,auVar175,0);
  fVar178 = auVar94._0_4_ * auVar18._0_4_;
  fVar143 = auVar94._4_4_ * auVar18._4_4_;
  fVar179 = auVar94._8_4_ * auVar18._8_4_;
  fVar144 = auVar94._12_4_ * auVar18._12_4_;
  auVar175 = vdpps_avx(auVar18,auVar73,0x7f);
  auVar72 = vshufps_avx(auVar15,auVar15,0);
  auVar203._0_4_ = auVar72._0_4_ * auVar73._0_4_;
  auVar203._4_4_ = auVar72._4_4_ * auVar73._4_4_;
  auVar203._8_4_ = auVar72._8_4_ * auVar73._8_4_;
  auVar203._12_4_ = auVar72._12_4_ * auVar73._12_4_;
  auVar175 = vshufps_avx(auVar175,auVar175,0);
  auVar166._0_4_ = auVar175._0_4_ * auVar18._0_4_;
  auVar166._4_4_ = auVar175._4_4_ * auVar18._4_4_;
  auVar166._8_4_ = auVar175._8_4_ * auVar18._8_4_;
  auVar166._12_4_ = auVar175._12_4_ * auVar18._12_4_;
  auVar18 = vsubps_avx(auVar203,auVar166);
  auVar95 = vrcpss_avx(auVar95,auVar95);
  auVar95 = ZEXT416((uint)((2.0 - auVar15._0_4_ * auVar95._0_4_) * auVar95._0_4_));
  auVar95 = vshufps_avx(auVar95,auVar95,0);
  auVar15 = vshufps_avx(_local_680,_local_680,0xff);
  auVar228._0_4_ = auVar15._0_4_ * fVar160;
  auVar228._4_4_ = auVar15._4_4_ * fVar124;
  auVar228._8_4_ = auVar15._8_4_ * fVar177;
  auVar228._12_4_ = auVar15._12_4_ * fVar142;
  _local_460 = vsubps_avx(_local_680,auVar228);
  auVar175 = vshufps_avx(auVar77,auVar77,0xff);
  auVar185._0_4_ =
       auVar175._0_4_ * fVar160 + auVar74._0_4_ * auVar109._0_4_ * auVar17._0_4_ * auVar15._0_4_;
  auVar185._4_4_ =
       auVar175._4_4_ * fVar124 + auVar74._4_4_ * auVar109._4_4_ * auVar17._4_4_ * auVar15._4_4_;
  auVar185._8_4_ =
       auVar175._8_4_ * fVar177 + auVar74._8_4_ * auVar109._8_4_ * auVar17._8_4_ * auVar15._8_4_;
  auVar185._12_4_ =
       auVar175._12_4_ * fVar142 +
       auVar74._12_4_ * auVar109._12_4_ * auVar17._12_4_ * auVar15._12_4_;
  auVar17 = vsubps_avx(auVar77,auVar185);
  local_470._0_4_ = auVar228._0_4_ + (float)local_680._0_4_;
  local_470._4_4_ = auVar228._4_4_ + (float)local_680._4_4_;
  fStack_468 = auVar228._8_4_ + fStack_678;
  fStack_464 = auVar228._12_4_ + fStack_674;
  auVar15 = vshufps_avx(auVar128,auVar128,0xff);
  auVar113._0_4_ = fVar178 * auVar15._0_4_;
  auVar113._4_4_ = fVar143 * auVar15._4_4_;
  auVar113._8_4_ = fVar179 * auVar15._8_4_;
  auVar113._12_4_ = fVar144 * auVar15._12_4_;
  _local_480 = vsubps_avx(auVar128,auVar113);
  auVar175 = vshufps_avx(auVar116,auVar116,0xff);
  auVar88._0_4_ =
       fVar178 * auVar175._0_4_ + auVar15._0_4_ * auVar94._0_4_ * auVar18._0_4_ * auVar95._0_4_;
  auVar88._4_4_ =
       fVar143 * auVar175._4_4_ + auVar15._4_4_ * auVar94._4_4_ * auVar18._4_4_ * auVar95._4_4_;
  auVar88._8_4_ =
       fVar179 * auVar175._8_4_ + auVar15._8_4_ * auVar94._8_4_ * auVar18._8_4_ * auVar95._8_4_;
  auVar88._12_4_ =
       fVar144 * auVar175._12_4_ + auVar15._12_4_ * auVar94._12_4_ * auVar18._12_4_ * auVar95._12_4_
  ;
  auVar18 = vsubps_avx(auVar116,auVar88);
  local_490._0_4_ = auVar128._0_4_ + auVar113._0_4_;
  local_490._4_4_ = auVar128._4_4_ + auVar113._4_4_;
  fStack_488 = auVar128._8_4_ + auVar113._8_4_;
  fStack_484 = auVar128._12_4_ + auVar113._12_4_;
  local_4a0._0_4_ = local_460._0_4_ + auVar17._0_4_ * 0.33333334;
  local_4a0._4_4_ = local_460._4_4_ + auVar17._4_4_ * 0.33333334;
  fStack_498 = local_460._8_4_ + auVar17._8_4_ * 0.33333334;
  fStack_494 = local_460._12_4_ + auVar17._12_4_ * 0.33333334;
  local_360 = vsubps_avx(_local_460,auVar16);
  auVar15 = vmovsldup_avx(local_360);
  auVar95 = vmovshdup_avx(local_360);
  auVar175 = vshufps_avx(local_360,local_360,0xaa);
  fVar160 = pre->ray_space[k].vx.field_0.m128[0];
  fVar124 = pre->ray_space[k].vx.field_0.m128[1];
  fVar177 = pre->ray_space[k].vx.field_0.m128[2];
  fVar142 = pre->ray_space[k].vx.field_0.m128[3];
  fVar178 = pre->ray_space[k].vy.field_0.m128[0];
  fVar143 = pre->ray_space[k].vy.field_0.m128[1];
  fVar179 = pre->ray_space[k].vy.field_0.m128[2];
  fVar144 = pre->ray_space[k].vy.field_0.m128[3];
  fVar180 = pre->ray_space[k].vz.field_0.m128[0];
  fVar193 = pre->ray_space[k].vz.field_0.m128[1];
  fVar194 = pre->ray_space[k].vz.field_0.m128[2];
  fVar195 = pre->ray_space[k].vz.field_0.m128[3];
  fVar86 = fVar160 * auVar15._0_4_ + auVar175._0_4_ * fVar180 + fVar178 * auVar95._0_4_;
  fVar107 = fVar124 * auVar15._4_4_ + auVar175._4_4_ * fVar193 + fVar143 * auVar95._4_4_;
  local_680._4_4_ = fVar107;
  local_680._0_4_ = fVar86;
  fStack_678 = fVar177 * auVar15._8_4_ + auVar175._8_4_ * fVar194 + fVar179 * auVar95._8_4_;
  fStack_674 = fVar142 * auVar15._12_4_ + auVar175._12_4_ * fVar195 + fVar144 * auVar95._12_4_;
  local_370 = vsubps_avx(_local_4a0,auVar16);
  auVar175 = vshufps_avx(local_370,local_370,0xaa);
  auVar95 = vmovshdup_avx(local_370);
  auVar15 = vmovsldup_avx(local_370);
  fVar87 = auVar15._0_4_ * fVar160 + auVar95._0_4_ * fVar178 + fVar180 * auVar175._0_4_;
  fVar108 = auVar15._4_4_ * fVar124 + auVar95._4_4_ * fVar143 + fVar193 * auVar175._4_4_;
  local_6a0._4_4_ = fVar108;
  local_6a0._0_4_ = fVar87;
  fStack_698 = auVar15._8_4_ * fVar177 + auVar95._8_4_ * fVar179 + fVar194 * auVar175._8_4_;
  fStack_694 = auVar15._12_4_ * fVar142 + auVar95._12_4_ * fVar144 + fVar195 * auVar175._12_4_;
  auVar167._0_4_ = auVar18._0_4_ * 0.33333334;
  auVar167._4_4_ = auVar18._4_4_ * 0.33333334;
  auVar167._8_4_ = auVar18._8_4_ * 0.33333334;
  auVar167._12_4_ = auVar18._12_4_ * 0.33333334;
  _local_4b0 = vsubps_avx(_local_480,auVar167);
  local_380 = vsubps_avx(_local_4b0,auVar16);
  auVar175 = vshufps_avx(local_380,local_380,0xaa);
  auVar95 = vmovshdup_avx(local_380);
  auVar15 = vmovsldup_avx(local_380);
  auVar281._0_4_ = auVar15._0_4_ * fVar160 + auVar95._0_4_ * fVar178 + fVar180 * auVar175._0_4_;
  auVar281._4_4_ = auVar15._4_4_ * fVar124 + auVar95._4_4_ * fVar143 + fVar193 * auVar175._4_4_;
  auVar281._8_4_ = auVar15._8_4_ * fVar177 + auVar95._8_4_ * fVar179 + fVar194 * auVar175._8_4_;
  auVar281._12_4_ = auVar15._12_4_ * fVar142 + auVar95._12_4_ * fVar144 + fVar195 * auVar175._12_4_;
  local_390 = vsubps_avx(_local_480,auVar16);
  auVar175 = vshufps_avx(local_390,local_390,0xaa);
  auVar95 = vmovshdup_avx(local_390);
  auVar15 = vmovsldup_avx(local_390);
  auVar263._0_4_ = auVar15._0_4_ * fVar160 + auVar95._0_4_ * fVar178 + auVar175._0_4_ * fVar180;
  auVar263._4_4_ = auVar15._4_4_ * fVar124 + auVar95._4_4_ * fVar143 + auVar175._4_4_ * fVar193;
  auVar263._8_4_ = auVar15._8_4_ * fVar177 + auVar95._8_4_ * fVar179 + auVar175._8_4_ * fVar194;
  auVar263._12_4_ = auVar15._12_4_ * fVar142 + auVar95._12_4_ * fVar144 + auVar175._12_4_ * fVar195;
  local_3a0 = vsubps_avx(_local_470,auVar16);
  auVar175 = vshufps_avx(local_3a0,local_3a0,0xaa);
  auVar95 = vmovshdup_avx(local_3a0);
  auVar15 = vmovsldup_avx(local_3a0);
  auVar240._0_4_ = auVar15._0_4_ * fVar160 + auVar95._0_4_ * fVar178 + auVar175._0_4_ * fVar180;
  auVar240._4_4_ = auVar15._4_4_ * fVar124 + auVar95._4_4_ * fVar143 + auVar175._4_4_ * fVar193;
  auVar240._8_4_ = auVar15._8_4_ * fVar177 + auVar95._8_4_ * fVar179 + auVar175._8_4_ * fVar194;
  auVar240._12_4_ = auVar15._12_4_ * fVar142 + auVar95._12_4_ * fVar144 + auVar175._12_4_ * fVar195;
  local_4c0._0_4_ = (float)local_470._0_4_ + (fVar298 + auVar185._0_4_) * 0.33333334;
  local_4c0._4_4_ = (float)local_470._4_4_ + (fVar300 + auVar185._4_4_) * 0.33333334;
  fStack_4b8 = fStack_468 + (fVar238 + auVar185._8_4_) * 0.33333334;
  fStack_4b4 = fStack_464 + (fVar247 + auVar185._12_4_) * 0.33333334;
  local_3b0 = vsubps_avx(_local_4c0,auVar16);
  auVar175 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar95 = vmovshdup_avx(local_3b0);
  auVar15 = vmovsldup_avx(local_3b0);
  auVar214._0_4_ = auVar15._0_4_ * fVar160 + auVar95._0_4_ * fVar178 + auVar175._0_4_ * fVar180;
  auVar214._4_4_ = auVar15._4_4_ * fVar124 + auVar95._4_4_ * fVar143 + auVar175._4_4_ * fVar193;
  auVar214._8_4_ = auVar15._8_4_ * fVar177 + auVar95._8_4_ * fVar179 + auVar175._8_4_ * fVar194;
  auVar214._12_4_ = auVar15._12_4_ * fVar142 + auVar95._12_4_ * fVar144 + auVar175._12_4_ * fVar195;
  auVar204._0_4_ = (fVar248 + auVar88._0_4_) * 0.33333334;
  auVar204._4_4_ = (fVar249 + auVar88._4_4_) * 0.33333334;
  auVar204._8_4_ = (fVar250 + auVar88._8_4_) * 0.33333334;
  auVar204._12_4_ = (fVar258 + auVar88._12_4_) * 0.33333334;
  _local_3f0 = vsubps_avx(_local_490,auVar204);
  local_3c0 = vsubps_avx(_local_3f0,auVar16);
  auVar175 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar95 = vmovshdup_avx(local_3c0);
  auVar15 = vmovsldup_avx(local_3c0);
  auVar89._0_4_ = auVar15._0_4_ * fVar160 + auVar95._0_4_ * fVar178 + fVar180 * auVar175._0_4_;
  auVar89._4_4_ = auVar15._4_4_ * fVar124 + auVar95._4_4_ * fVar143 + fVar193 * auVar175._4_4_;
  auVar89._8_4_ = auVar15._8_4_ * fVar177 + auVar95._8_4_ * fVar179 + fVar194 * auVar175._8_4_;
  auVar89._12_4_ = auVar15._12_4_ * fVar142 + auVar95._12_4_ * fVar144 + fVar195 * auVar175._12_4_;
  local_3d0 = vsubps_avx(_local_490,auVar16);
  auVar175 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar95 = vmovshdup_avx(local_3d0);
  auVar15 = vmovsldup_avx(local_3d0);
  auVar75._0_4_ = fVar160 * auVar15._0_4_ + fVar178 * auVar95._0_4_ + fVar180 * auVar175._0_4_;
  auVar75._4_4_ = fVar124 * auVar15._4_4_ + fVar143 * auVar95._4_4_ + fVar193 * auVar175._4_4_;
  auVar75._8_4_ = fVar177 * auVar15._8_4_ + fVar179 * auVar95._8_4_ + fVar194 * auVar175._8_4_;
  auVar75._12_4_ = fVar142 * auVar15._12_4_ + fVar144 * auVar95._12_4_ + fVar195 * auVar175._12_4_;
  auVar16 = vmovlhps_avx(_local_680,auVar240);
  auVar17 = vmovlhps_avx(_local_6a0,auVar214);
  auVar18 = vmovlhps_avx(auVar281,auVar89);
  auVar73 = vmovlhps_avx(auVar263,auVar75);
  auVar95 = vminps_avx(auVar16,auVar17);
  auVar15 = vminps_avx(auVar18,auVar73);
  auVar175 = vminps_avx(auVar95,auVar15);
  auVar95 = vmaxps_avx(auVar16,auVar17);
  auVar15 = vmaxps_avx(auVar18,auVar73);
  auVar95 = vmaxps_avx(auVar95,auVar15);
  auVar15 = vshufpd_avx(auVar175,auVar175,3);
  auVar175 = vminps_avx(auVar175,auVar15);
  auVar15 = vshufpd_avx(auVar95,auVar95,3);
  auVar15 = vmaxps_avx(auVar95,auVar15);
  auVar186._8_4_ = 0x7fffffff;
  auVar186._0_8_ = 0x7fffffff7fffffff;
  auVar186._12_4_ = 0x7fffffff;
  auVar95 = vandps_avx(auVar175,auVar186);
  auVar15 = vandps_avx(auVar15,auVar186);
  auVar95 = vmaxps_avx(auVar95,auVar15);
  auVar15 = vmovshdup_avx(auVar95);
  auVar95 = vmaxss_avx(auVar15,auVar95);
  fVar124 = auVar95._0_4_ * 9.536743e-07;
  auVar95 = vshufps_avx(ZEXT416((uint)fVar124),ZEXT416((uint)fVar124),0);
  local_280._16_16_ = auVar95;
  local_280._0_16_ = auVar95;
  auVar76._0_8_ = auVar95._0_8_ ^ 0x8000000080000000;
  auVar76._8_4_ = auVar95._8_4_ ^ 0x80000000;
  auVar76._12_4_ = auVar95._12_4_ ^ 0x80000000;
  local_2a0._16_16_ = auVar76;
  local_2a0._0_16_ = auVar76;
  auVar95 = vshufps_avx(ZEXT416(uVar62),ZEXT416(uVar62),0);
  local_2c0._16_16_ = auVar95;
  local_2c0._0_16_ = auVar95;
  auVar95 = vshufps_avx(ZEXT416(uVar69),ZEXT416(uVar69),0);
  local_2e0._16_16_ = auVar95;
  local_2e0._0_16_ = auVar95;
  uVar70 = 0;
  fVar160 = *(float *)(ray + k * 4 + 0x60);
  _local_330 = vsubps_avx(auVar17,auVar16);
  _local_340 = vsubps_avx(auVar18,auVar17);
  _local_350 = vsubps_avx(auVar73,auVar18);
  _local_400 = vsubps_avx(_local_470,_local_460);
  _local_410 = vsubps_avx(_local_4c0,_local_4a0);
  _local_420 = vsubps_avx(_local_3f0,_local_4b0);
  _local_430 = vsubps_avx(_local_490,_local_480);
  local_700 = ZEXT816(0x3f80000000000000);
  local_3e0 = local_700;
  do {
    auVar95 = vshufps_avx(local_700,local_700,0x50);
    auVar302._8_4_ = 0x3f800000;
    auVar302._0_8_ = &DAT_3f8000003f800000;
    auVar302._12_4_ = 0x3f800000;
    auVar305._16_4_ = 0x3f800000;
    auVar305._0_16_ = auVar302;
    auVar305._20_4_ = 0x3f800000;
    auVar305._24_4_ = 0x3f800000;
    auVar305._28_4_ = 0x3f800000;
    auVar15 = vsubps_avx(auVar302,auVar95);
    fVar177 = auVar95._0_4_;
    fVar142 = auVar95._4_4_;
    fVar178 = auVar95._8_4_;
    fVar143 = auVar95._12_4_;
    fVar179 = auVar15._0_4_;
    fVar144 = auVar15._4_4_;
    fVar180 = auVar15._8_4_;
    fVar193 = auVar15._12_4_;
    auVar114._0_4_ = auVar240._0_4_ * fVar177 + fVar179 * fVar86;
    auVar114._4_4_ = auVar240._4_4_ * fVar142 + fVar144 * fVar107;
    auVar114._8_4_ = auVar240._0_4_ * fVar178 + fVar180 * fVar86;
    auVar114._12_4_ = auVar240._4_4_ * fVar143 + fVar193 * fVar107;
    auVar90._0_4_ = auVar214._0_4_ * fVar177 + fVar87 * fVar179;
    auVar90._4_4_ = auVar214._4_4_ * fVar142 + fVar108 * fVar144;
    auVar90._8_4_ = auVar214._0_4_ * fVar178 + fVar87 * fVar180;
    auVar90._12_4_ = auVar214._4_4_ * fVar143 + fVar108 * fVar193;
    auVar205._0_4_ = auVar89._0_4_ * fVar177 + auVar281._0_4_ * fVar179;
    auVar205._4_4_ = auVar89._4_4_ * fVar142 + auVar281._4_4_ * fVar144;
    auVar205._8_4_ = auVar89._0_4_ * fVar178 + auVar281._0_4_ * fVar180;
    auVar205._12_4_ = auVar89._4_4_ * fVar143 + auVar281._4_4_ * fVar193;
    auVar129._0_4_ = auVar75._0_4_ * fVar177 + auVar263._0_4_ * fVar179;
    auVar129._4_4_ = auVar75._4_4_ * fVar142 + auVar263._4_4_ * fVar144;
    auVar129._8_4_ = auVar75._0_4_ * fVar178 + auVar263._0_4_ * fVar180;
    auVar129._12_4_ = auVar75._4_4_ * fVar143 + auVar263._4_4_ * fVar193;
    auVar95 = vmovshdup_avx(local_3e0);
    auVar15 = vshufps_avx(local_3e0,local_3e0,0);
    auVar221._16_16_ = auVar15;
    auVar221._0_16_ = auVar15;
    auVar175 = vshufps_avx(local_3e0,local_3e0,0x55);
    auVar81._16_16_ = auVar175;
    auVar81._0_16_ = auVar175;
    auVar80 = vsubps_avx(auVar81,auVar221);
    auVar175 = vshufps_avx(auVar114,auVar114,0);
    auVar74 = vshufps_avx(auVar114,auVar114,0x55);
    auVar94 = vshufps_avx(auVar90,auVar90,0);
    auVar72 = vshufps_avx(auVar90,auVar90,0x55);
    auVar77 = vshufps_avx(auVar205,auVar205,0);
    auVar116 = vshufps_avx(auVar205,auVar205,0x55);
    auVar109 = vshufps_avx(auVar129,auVar129,0);
    auVar110 = vshufps_avx(auVar129,auVar129,0x55);
    auVar95 = ZEXT416((uint)((auVar95._0_4_ - local_3e0._0_4_) * 0.04761905));
    auVar95 = vshufps_avx(auVar95,auVar95,0);
    auVar237._0_4_ = auVar15._0_4_ + auVar80._0_4_ * 0.0;
    auVar237._4_4_ = auVar15._4_4_ + auVar80._4_4_ * 0.14285715;
    auVar237._8_4_ = auVar15._8_4_ + auVar80._8_4_ * 0.2857143;
    auVar237._12_4_ = auVar15._12_4_ + auVar80._12_4_ * 0.42857146;
    auVar237._16_4_ = auVar15._0_4_ + auVar80._16_4_ * 0.5714286;
    auVar237._20_4_ = auVar15._4_4_ + auVar80._20_4_ * 0.71428573;
    auVar237._24_4_ = auVar15._8_4_ + auVar80._24_4_ * 0.8571429;
    auVar237._28_4_ = auVar15._12_4_ + auVar80._28_4_;
    auVar21 = vsubps_avx(auVar305,auVar237);
    fVar247 = auVar94._0_4_;
    fVar249 = auVar94._4_4_;
    fVar261 = auVar94._8_4_;
    fVar268 = auVar94._12_4_;
    fVar177 = auVar21._0_4_;
    fVar179 = auVar21._4_4_;
    fVar194 = auVar21._8_4_;
    fVar238 = auVar21._12_4_;
    fVar289 = auVar175._12_4_;
    fVar250 = auVar21._16_4_;
    fVar258 = auVar21._20_4_;
    fVar259 = auVar21._24_4_;
    fVar288 = auVar72._0_4_;
    fVar296 = auVar72._4_4_;
    fVar196 = auVar72._8_4_;
    fVar278 = auVar72._12_4_;
    local_6a0._0_4_ = auVar74._0_4_;
    local_6a0._4_4_ = auVar74._4_4_;
    fStack_698 = auVar74._8_4_;
    fStack_694 = auVar74._12_4_;
    fVar142 = auVar77._0_4_;
    fVar143 = auVar77._4_4_;
    fVar180 = auVar77._8_4_;
    fVar195 = auVar77._12_4_;
    fVar248 = auVar237._0_4_ * fVar142 + fVar247 * fVar177;
    fVar260 = auVar237._4_4_ * fVar143 + fVar249 * fVar179;
    fVar266 = auVar237._8_4_ * fVar180 + fVar261 * fVar194;
    fVar270 = auVar237._12_4_ * fVar195 + fVar268 * fVar238;
    fVar279 = auVar237._16_4_ * fVar142 + fVar247 * fVar250;
    fVar286 = auVar237._20_4_ * fVar143 + fVar249 * fVar258;
    fVar287 = auVar237._24_4_ * fVar180 + fVar261 * fVar259;
    fVar178 = auVar116._0_4_;
    fVar144 = auVar116._4_4_;
    fVar193 = auVar116._8_4_;
    fVar298 = auVar116._12_4_;
    fVar291 = auVar237._0_4_ * fVar178 + fVar288 * fVar177;
    fVar267 = auVar237._4_4_ * fVar144 + fVar296 * fVar179;
    fVar269 = auVar237._8_4_ * fVar193 + fVar196 * fVar194;
    fVar271 = auVar237._12_4_ * fVar298 + fVar278 * fVar238;
    fVar272 = auVar237._16_4_ * fVar178 + fVar288 * fVar250;
    fVar274 = auVar237._20_4_ * fVar144 + fVar296 * fVar258;
    fVar276 = auVar237._24_4_ * fVar193 + fVar196 * fVar259;
    auVar15 = vshufps_avx(auVar114,auVar114,0xaa);
    auVar74 = vshufps_avx(auVar114,auVar114,0xff);
    fVar300 = fVar195 + 0.0;
    auVar94 = vshufps_avx(auVar90,auVar90,0xaa);
    auVar72 = vshufps_avx(auVar90,auVar90,0xff);
    auVar82._0_4_ =
         fVar177 * (fVar247 * auVar237._0_4_ + auVar175._0_4_ * fVar177) + auVar237._0_4_ * fVar248;
    auVar82._4_4_ =
         fVar179 * (fVar249 * auVar237._4_4_ + auVar175._4_4_ * fVar179) + auVar237._4_4_ * fVar260;
    auVar82._8_4_ =
         fVar194 * (fVar261 * auVar237._8_4_ + auVar175._8_4_ * fVar194) + auVar237._8_4_ * fVar266;
    auVar82._12_4_ =
         fVar238 * (fVar268 * auVar237._12_4_ + fVar289 * fVar238) + auVar237._12_4_ * fVar270;
    auVar82._16_4_ =
         fVar250 * (fVar247 * auVar237._16_4_ + auVar175._0_4_ * fVar250) +
         auVar237._16_4_ * fVar279;
    auVar82._20_4_ =
         fVar258 * (fVar249 * auVar237._20_4_ + auVar175._4_4_ * fVar258) +
         auVar237._20_4_ * fVar286;
    auVar82._24_4_ =
         fVar259 * (fVar261 * auVar237._24_4_ + auVar175._8_4_ * fVar259) +
         auVar237._24_4_ * fVar287;
    auVar82._28_4_ = fVar289 + 1.0 + fVar298;
    auVar138._0_4_ =
         fVar177 * (fVar288 * auVar237._0_4_ + fVar177 * (float)local_6a0._0_4_) +
         auVar237._0_4_ * fVar291;
    auVar138._4_4_ =
         fVar179 * (fVar296 * auVar237._4_4_ + fVar179 * (float)local_6a0._4_4_) +
         auVar237._4_4_ * fVar267;
    auVar138._8_4_ =
         fVar194 * (fVar196 * auVar237._8_4_ + fVar194 * fStack_698) + auVar237._8_4_ * fVar269;
    auVar138._12_4_ =
         fVar238 * (fVar278 * auVar237._12_4_ + fVar238 * fStack_694) + auVar237._12_4_ * fVar271;
    auVar138._16_4_ =
         fVar250 * (fVar288 * auVar237._16_4_ + fVar250 * (float)local_6a0._0_4_) +
         auVar237._16_4_ * fVar272;
    auVar138._20_4_ =
         fVar258 * (fVar296 * auVar237._20_4_ + fVar258 * (float)local_6a0._4_4_) +
         auVar237._20_4_ * fVar274;
    auVar138._24_4_ =
         fVar259 * (fVar196 * auVar237._24_4_ + fVar259 * fStack_698) + auVar237._24_4_ * fVar276;
    auVar138._28_4_ = fVar289 + 1.0 + fVar298;
    auVar157._0_4_ =
         fVar177 * fVar248 + auVar237._0_4_ * (auVar109._0_4_ * auVar237._0_4_ + fVar177 * fVar142);
    auVar157._4_4_ =
         fVar179 * fVar260 + auVar237._4_4_ * (auVar109._4_4_ * auVar237._4_4_ + fVar179 * fVar143);
    auVar157._8_4_ =
         fVar194 * fVar266 + auVar237._8_4_ * (auVar109._8_4_ * auVar237._8_4_ + fVar194 * fVar180);
    auVar157._12_4_ =
         fVar238 * fVar270 +
         auVar237._12_4_ * (auVar109._12_4_ * auVar237._12_4_ + fVar238 * fVar195);
    auVar157._16_4_ =
         fVar250 * fVar279 +
         auVar237._16_4_ * (auVar109._0_4_ * auVar237._16_4_ + fVar250 * fVar142);
    auVar157._20_4_ =
         fVar258 * fVar286 +
         auVar237._20_4_ * (auVar109._4_4_ * auVar237._20_4_ + fVar258 * fVar143);
    auVar157._24_4_ =
         fVar259 * fVar287 +
         auVar237._24_4_ * (auVar109._8_4_ * auVar237._24_4_ + fVar259 * fVar180);
    auVar157._28_4_ = fVar298 + fVar300;
    auVar246._0_4_ =
         fVar177 * fVar291 + auVar237._0_4_ * (auVar110._0_4_ * auVar237._0_4_ + fVar177 * fVar178);
    auVar246._4_4_ =
         fVar179 * fVar267 + auVar237._4_4_ * (auVar110._4_4_ * auVar237._4_4_ + fVar179 * fVar144);
    auVar246._8_4_ =
         fVar194 * fVar269 + auVar237._8_4_ * (auVar110._8_4_ * auVar237._8_4_ + fVar194 * fVar193);
    auVar246._12_4_ =
         fVar238 * fVar271 +
         auVar237._12_4_ * (auVar110._12_4_ * auVar237._12_4_ + fVar238 * fVar298);
    auVar246._16_4_ =
         fVar250 * fVar272 +
         auVar237._16_4_ * (auVar110._0_4_ * auVar237._16_4_ + fVar250 * fVar178);
    auVar246._20_4_ =
         fVar258 * fVar274 +
         auVar237._20_4_ * (auVar110._4_4_ * auVar237._20_4_ + fVar258 * fVar144);
    auVar246._24_4_ =
         fVar259 * fVar276 +
         auVar237._24_4_ * (auVar110._8_4_ * auVar237._24_4_ + fVar259 * fVar193);
    auVar246._28_4_ = fVar300 + fVar298 + 0.0;
    local_1c0._0_4_ = fVar177 * auVar82._0_4_ + auVar237._0_4_ * auVar157._0_4_;
    local_1c0._4_4_ = fVar179 * auVar82._4_4_ + auVar237._4_4_ * auVar157._4_4_;
    local_1c0._8_4_ = fVar194 * auVar82._8_4_ + auVar237._8_4_ * auVar157._8_4_;
    local_1c0._12_4_ = fVar238 * auVar82._12_4_ + auVar237._12_4_ * auVar157._12_4_;
    local_1c0._16_4_ = fVar250 * auVar82._16_4_ + auVar237._16_4_ * auVar157._16_4_;
    local_1c0._20_4_ = fVar258 * auVar82._20_4_ + auVar237._20_4_ * auVar157._20_4_;
    local_1c0._24_4_ = fVar259 * auVar82._24_4_ + auVar237._24_4_ * auVar157._24_4_;
    local_1c0._28_4_ = fVar289 + fVar268 + fVar298 + 0.0;
    local_1e0._0_4_ = fVar177 * auVar138._0_4_ + auVar237._0_4_ * auVar246._0_4_;
    local_1e0._4_4_ = fVar179 * auVar138._4_4_ + auVar237._4_4_ * auVar246._4_4_;
    local_1e0._8_4_ = fVar194 * auVar138._8_4_ + auVar237._8_4_ * auVar246._8_4_;
    local_1e0._12_4_ = fVar238 * auVar138._12_4_ + auVar237._12_4_ * auVar246._12_4_;
    local_1e0._16_4_ = fVar250 * auVar138._16_4_ + auVar237._16_4_ * auVar246._16_4_;
    local_1e0._20_4_ = fVar258 * auVar138._20_4_ + auVar237._20_4_ * auVar246._20_4_;
    local_1e0._24_4_ = fVar259 * auVar138._24_4_ + auVar237._24_4_ * auVar246._24_4_;
    local_1e0._28_4_ = fVar289 + fVar268 + fVar300;
    auVar22 = vsubps_avx(auVar157,auVar82);
    auVar80 = vsubps_avx(auVar246,auVar138);
    local_660 = auVar95._0_4_;
    fStack_65c = auVar95._4_4_;
    fStack_658 = auVar95._8_4_;
    fStack_654 = auVar95._12_4_;
    local_220 = local_660 * auVar22._0_4_ * 3.0;
    fStack_21c = fStack_65c * auVar22._4_4_ * 3.0;
    auVar23._4_4_ = fStack_21c;
    auVar23._0_4_ = local_220;
    fStack_218 = fStack_658 * auVar22._8_4_ * 3.0;
    auVar23._8_4_ = fStack_218;
    fStack_214 = fStack_654 * auVar22._12_4_ * 3.0;
    auVar23._12_4_ = fStack_214;
    fStack_210 = local_660 * auVar22._16_4_ * 3.0;
    auVar23._16_4_ = fStack_210;
    fStack_20c = fStack_65c * auVar22._20_4_ * 3.0;
    auVar23._20_4_ = fStack_20c;
    fStack_208 = fStack_658 * auVar22._24_4_ * 3.0;
    auVar23._24_4_ = fStack_208;
    auVar23._28_4_ = auVar22._28_4_;
    fVar260 = local_660 * auVar80._0_4_ * 3.0;
    fVar261 = fStack_65c * auVar80._4_4_ * 3.0;
    auVar24._4_4_ = fVar261;
    auVar24._0_4_ = fVar260;
    fVar266 = fStack_658 * auVar80._8_4_ * 3.0;
    auVar24._8_4_ = fVar266;
    fVar268 = fStack_654 * auVar80._12_4_ * 3.0;
    auVar24._12_4_ = fVar268;
    fVar270 = local_660 * auVar80._16_4_ * 3.0;
    auVar24._16_4_ = fVar270;
    fVar279 = fStack_65c * auVar80._20_4_ * 3.0;
    auVar24._20_4_ = fVar279;
    fVar286 = fStack_658 * auVar80._24_4_ * 3.0;
    auVar24._24_4_ = fVar286;
    auVar24._28_4_ = auVar157._28_4_;
    auVar23 = vsubps_avx(local_1c0,auVar23);
    auVar80 = vperm2f128_avx(auVar23,auVar23,1);
    auVar80 = vshufps_avx(auVar80,auVar23,0x30);
    auVar80 = vshufps_avx(auVar23,auVar80,0x29);
    auVar24 = vsubps_avx(local_1e0,auVar24);
    auVar23 = vperm2f128_avx(auVar24,auVar24,1);
    auVar23 = vshufps_avx(auVar23,auVar24,0x30);
    auVar81 = vshufps_avx(auVar24,auVar23,0x29);
    fVar292 = auVar94._0_4_;
    fVar297 = auVar94._4_4_;
    fVar299 = auVar94._8_4_;
    fVar142 = auVar72._0_4_;
    fVar144 = auVar72._4_4_;
    fVar195 = auVar72._8_4_;
    fVar247 = auVar72._12_4_;
    fVar290 = auVar74._12_4_;
    auVar95 = vshufps_avx(auVar205,auVar205,0xaa);
    fVar178 = auVar95._0_4_;
    fVar180 = auVar95._4_4_;
    fVar298 = auVar95._8_4_;
    fVar248 = auVar95._12_4_;
    fVar271 = auVar237._0_4_ * fVar178 + fVar292 * fVar177;
    fVar272 = auVar237._4_4_ * fVar180 + fVar297 * fVar179;
    fVar274 = auVar237._8_4_ * fVar298 + fVar299 * fVar194;
    fVar276 = auVar237._12_4_ * fVar248 + auVar94._12_4_ * fVar238;
    fVar273 = auVar237._16_4_ * fVar178 + fVar292 * fVar250;
    fVar275 = auVar237._20_4_ * fVar180 + fVar297 * fVar258;
    fVar277 = auVar237._24_4_ * fVar298 + fVar299 * fVar259;
    fVar278 = fVar290 + fVar289 + fVar278;
    auVar95 = vshufps_avx(auVar205,auVar205,0xff);
    fVar143 = auVar95._0_4_;
    fVar193 = auVar95._4_4_;
    fVar300 = auVar95._8_4_;
    fVar249 = auVar95._12_4_;
    fVar287 = auVar237._0_4_ * fVar143 + fVar177 * fVar142;
    fVar288 = auVar237._4_4_ * fVar193 + fVar179 * fVar144;
    fVar291 = auVar237._8_4_ * fVar300 + fVar194 * fVar195;
    fVar296 = auVar237._12_4_ * fVar249 + fVar238 * fVar247;
    fVar267 = auVar237._16_4_ * fVar143 + fVar250 * fVar142;
    fVar196 = auVar237._20_4_ * fVar193 + fVar258 * fVar144;
    fVar269 = auVar237._24_4_ * fVar300 + fVar259 * fVar195;
    auVar95 = vshufps_avx(auVar129,auVar129,0xaa);
    auVar175 = vshufps_avx(auVar129,auVar129,0xff);
    fVar289 = auVar175._12_4_;
    auVar83._0_4_ =
         auVar237._0_4_ * fVar271 + fVar177 * (fVar292 * auVar237._0_4_ + auVar15._0_4_ * fVar177);
    auVar83._4_4_ =
         auVar237._4_4_ * fVar272 + fVar179 * (fVar297 * auVar237._4_4_ + auVar15._4_4_ * fVar179);
    auVar83._8_4_ =
         auVar237._8_4_ * fVar274 + fVar194 * (fVar299 * auVar237._8_4_ + auVar15._8_4_ * fVar194);
    auVar83._12_4_ =
         auVar237._12_4_ * fVar276 +
         fVar238 * (auVar94._12_4_ * auVar237._12_4_ + auVar15._12_4_ * fVar238);
    auVar83._16_4_ =
         auVar237._16_4_ * fVar273 + fVar250 * (fVar292 * auVar237._16_4_ + auVar15._0_4_ * fVar250)
    ;
    auVar83._20_4_ =
         auVar237._20_4_ * fVar275 + fVar258 * (fVar297 * auVar237._20_4_ + auVar15._4_4_ * fVar258)
    ;
    auVar83._24_4_ =
         auVar237._24_4_ * fVar277 + fVar259 * (fVar299 * auVar237._24_4_ + auVar15._8_4_ * fVar259)
    ;
    auVar83._28_4_ = fVar289 + auVar24._28_4_ + auVar23._28_4_;
    auVar285._0_4_ =
         auVar237._0_4_ * fVar287 + fVar177 * (auVar237._0_4_ * fVar142 + auVar74._0_4_ * fVar177);
    auVar285._4_4_ =
         auVar237._4_4_ * fVar288 + fVar179 * (auVar237._4_4_ * fVar144 + auVar74._4_4_ * fVar179);
    auVar285._8_4_ =
         auVar237._8_4_ * fVar291 + fVar194 * (auVar237._8_4_ * fVar195 + auVar74._8_4_ * fVar194);
    auVar285._12_4_ =
         auVar237._12_4_ * fVar296 + fVar238 * (auVar237._12_4_ * fVar247 + fVar290 * fVar238);
    auVar285._16_4_ =
         auVar237._16_4_ * fVar267 + fVar250 * (auVar237._16_4_ * fVar142 + auVar74._0_4_ * fVar250)
    ;
    auVar285._20_4_ =
         auVar237._20_4_ * fVar196 + fVar258 * (auVar237._20_4_ * fVar144 + auVar74._4_4_ * fVar258)
    ;
    auVar285._24_4_ =
         auVar237._24_4_ * fVar269 + fVar259 * (auVar237._24_4_ * fVar195 + auVar74._8_4_ * fVar259)
    ;
    auVar285._28_4_ = fVar289 + auVar23._28_4_ + auVar157._28_4_;
    auVar23 = vperm2f128_avx(local_1c0,local_1c0,1);
    auVar23 = vshufps_avx(auVar23,local_1c0,0x30);
    auVar82 = vshufps_avx(local_1c0,auVar23,0x29);
    auVar158._0_4_ =
         fVar177 * fVar271 + auVar237._0_4_ * (auVar95._0_4_ * auVar237._0_4_ + fVar177 * fVar178);
    auVar158._4_4_ =
         fVar179 * fVar272 + auVar237._4_4_ * (auVar95._4_4_ * auVar237._4_4_ + fVar179 * fVar180);
    auVar158._8_4_ =
         fVar194 * fVar274 + auVar237._8_4_ * (auVar95._8_4_ * auVar237._8_4_ + fVar194 * fVar298);
    auVar158._12_4_ =
         fVar238 * fVar276 +
         auVar237._12_4_ * (auVar95._12_4_ * auVar237._12_4_ + fVar238 * fVar248);
    auVar158._16_4_ =
         fVar250 * fVar273 + auVar237._16_4_ * (auVar95._0_4_ * auVar237._16_4_ + fVar250 * fVar178)
    ;
    auVar158._20_4_ =
         fVar258 * fVar275 + auVar237._20_4_ * (auVar95._4_4_ * auVar237._20_4_ + fVar258 * fVar180)
    ;
    auVar158._24_4_ =
         fVar259 * fVar277 + auVar237._24_4_ * (auVar95._8_4_ * auVar237._24_4_ + fVar259 * fVar298)
    ;
    auVar158._28_4_ = fVar278 + auVar95._12_4_ + fVar248;
    auVar192._0_4_ =
         fVar177 * fVar287 + auVar237._0_4_ * (auVar175._0_4_ * auVar237._0_4_ + fVar177 * fVar143);
    auVar192._4_4_ =
         fVar179 * fVar288 + auVar237._4_4_ * (auVar175._4_4_ * auVar237._4_4_ + fVar179 * fVar193);
    auVar192._8_4_ =
         fVar194 * fVar291 + auVar237._8_4_ * (auVar175._8_4_ * auVar237._8_4_ + fVar194 * fVar300);
    auVar192._12_4_ =
         fVar238 * fVar296 + auVar237._12_4_ * (fVar289 * auVar237._12_4_ + fVar238 * fVar249);
    auVar192._16_4_ =
         fVar250 * fVar267 +
         auVar237._16_4_ * (auVar175._0_4_ * auVar237._16_4_ + fVar250 * fVar143);
    auVar192._20_4_ =
         fVar258 * fVar196 +
         auVar237._20_4_ * (auVar175._4_4_ * auVar237._20_4_ + fVar258 * fVar193);
    auVar192._24_4_ =
         fVar259 * fVar269 +
         auVar237._24_4_ * (auVar175._8_4_ * auVar237._24_4_ + fVar259 * fVar300);
    auVar192._28_4_ = fVar290 + fVar247 + fVar289 + fVar249;
    auVar209._0_4_ = fVar177 * auVar83._0_4_ + auVar237._0_4_ * auVar158._0_4_;
    auVar209._4_4_ = fVar179 * auVar83._4_4_ + auVar237._4_4_ * auVar158._4_4_;
    auVar209._8_4_ = fVar194 * auVar83._8_4_ + auVar237._8_4_ * auVar158._8_4_;
    auVar209._12_4_ = fVar238 * auVar83._12_4_ + auVar237._12_4_ * auVar158._12_4_;
    auVar209._16_4_ = fVar250 * auVar83._16_4_ + auVar237._16_4_ * auVar158._16_4_;
    auVar209._20_4_ = fVar258 * auVar83._20_4_ + auVar237._20_4_ * auVar158._20_4_;
    auVar209._24_4_ = fVar259 * auVar83._24_4_ + auVar237._24_4_ * auVar158._24_4_;
    auVar209._28_4_ = fVar278 + fVar289 + fVar249;
    auVar222._0_4_ = fVar177 * auVar285._0_4_ + auVar237._0_4_ * auVar192._0_4_;
    auVar222._4_4_ = fVar179 * auVar285._4_4_ + auVar237._4_4_ * auVar192._4_4_;
    auVar222._8_4_ = fVar194 * auVar285._8_4_ + auVar237._8_4_ * auVar192._8_4_;
    auVar222._12_4_ = fVar238 * auVar285._12_4_ + auVar237._12_4_ * auVar192._12_4_;
    auVar222._16_4_ = fVar250 * auVar285._16_4_ + auVar237._16_4_ * auVar192._16_4_;
    auVar222._20_4_ = fVar258 * auVar285._20_4_ + auVar237._20_4_ * auVar192._20_4_;
    auVar222._24_4_ = fVar259 * auVar285._24_4_ + auVar237._24_4_ * auVar192._24_4_;
    auVar222._28_4_ = auVar21._28_4_ + auVar237._28_4_;
    auVar23 = vsubps_avx(auVar158,auVar83);
    auVar21 = vsubps_avx(auVar192,auVar285);
    local_240 = local_660 * auVar23._0_4_ * 3.0;
    fStack_23c = fStack_65c * auVar23._4_4_ * 3.0;
    auVar19._4_4_ = fStack_23c;
    auVar19._0_4_ = local_240;
    fStack_238 = fStack_658 * auVar23._8_4_ * 3.0;
    auVar19._8_4_ = fStack_238;
    fStack_234 = fStack_654 * auVar23._12_4_ * 3.0;
    auVar19._12_4_ = fStack_234;
    fStack_230 = local_660 * auVar23._16_4_ * 3.0;
    auVar19._16_4_ = fStack_230;
    fStack_22c = fStack_65c * auVar23._20_4_ * 3.0;
    auVar19._20_4_ = fStack_22c;
    fStack_228 = fStack_658 * auVar23._24_4_ * 3.0;
    auVar19._24_4_ = fStack_228;
    auVar19._28_4_ = auVar192._28_4_;
    local_260 = local_660 * auVar21._0_4_ * 3.0;
    fStack_25c = fStack_65c * auVar21._4_4_ * 3.0;
    auVar20._4_4_ = fStack_25c;
    auVar20._0_4_ = local_260;
    fStack_258 = fStack_658 * auVar21._8_4_ * 3.0;
    auVar20._8_4_ = fStack_258;
    fStack_254 = fStack_654 * auVar21._12_4_ * 3.0;
    auVar20._12_4_ = fStack_254;
    local_660 = local_660 * auVar21._16_4_ * 3.0;
    auVar20._16_4_ = local_660;
    fStack_65c = fStack_65c * auVar21._20_4_ * 3.0;
    auVar20._20_4_ = fStack_65c;
    fStack_658 = fStack_658 * auVar21._24_4_ * 3.0;
    auVar20._24_4_ = fStack_658;
    auVar20._28_4_ = fStack_654;
    auVar23 = vperm2f128_avx(auVar209,auVar209,1);
    auVar23 = vshufps_avx(auVar23,auVar209,0x30);
    auVar83 = vshufps_avx(auVar209,auVar23,0x29);
    auVar21 = vsubps_avx(auVar209,auVar19);
    auVar23 = vperm2f128_avx(auVar21,auVar21,1);
    auVar23 = vshufps_avx(auVar23,auVar21,0x30);
    auVar19 = vshufps_avx(auVar21,auVar23,0x29);
    auVar21 = vsubps_avx(auVar222,auVar20);
    auVar23 = vperm2f128_avx(auVar21,auVar21,1);
    auVar23 = vshufps_avx(auVar23,auVar21,0x30);
    auVar20 = vshufps_avx(auVar21,auVar23,0x29);
    auVar24 = vsubps_avx(auVar209,local_1c0);
    auVar25 = vsubps_avx(auVar83,auVar82);
    fVar177 = auVar25._0_4_ + auVar24._0_4_;
    fVar142 = auVar25._4_4_ + auVar24._4_4_;
    fVar178 = auVar25._8_4_ + auVar24._8_4_;
    fVar143 = auVar25._12_4_ + auVar24._12_4_;
    fVar179 = auVar25._16_4_ + auVar24._16_4_;
    fVar144 = auVar25._20_4_ + auVar24._20_4_;
    fVar180 = auVar25._24_4_ + auVar24._24_4_;
    auVar21 = vperm2f128_avx(local_1e0,local_1e0,1);
    auVar21 = vshufps_avx(auVar21,local_1e0,0x30);
    local_200 = vshufps_avx(local_1e0,auVar21,0x29);
    auVar21 = vperm2f128_avx(auVar222,auVar222,1);
    auVar21 = vshufps_avx(auVar21,auVar222,0x30);
    auVar138 = vshufps_avx(auVar222,auVar21,0x29);
    auVar21 = vsubps_avx(auVar222,local_1e0);
    auVar158 = vsubps_avx(auVar138,local_200);
    fVar193 = auVar21._0_4_ + auVar158._0_4_;
    fVar194 = auVar21._4_4_ + auVar158._4_4_;
    fVar195 = auVar21._8_4_ + auVar158._8_4_;
    fVar298 = auVar21._12_4_ + auVar158._12_4_;
    fVar300 = auVar21._16_4_ + auVar158._16_4_;
    fVar238 = auVar21._20_4_ + auVar158._20_4_;
    fVar247 = auVar21._24_4_ + auVar158._24_4_;
    fVar248 = auVar21._28_4_;
    auVar21._4_4_ = local_1e0._4_4_ * fVar142;
    auVar21._0_4_ = local_1e0._0_4_ * fVar177;
    auVar21._8_4_ = local_1e0._8_4_ * fVar178;
    auVar21._12_4_ = local_1e0._12_4_ * fVar143;
    auVar21._16_4_ = local_1e0._16_4_ * fVar179;
    auVar21._20_4_ = local_1e0._20_4_ * fVar144;
    auVar21._24_4_ = local_1e0._24_4_ * fVar180;
    auVar21._28_4_ = fVar248;
    auVar26._4_4_ = fVar194 * local_1c0._4_4_;
    auVar26._0_4_ = fVar193 * local_1c0._0_4_;
    auVar26._8_4_ = fVar195 * local_1c0._8_4_;
    auVar26._12_4_ = fVar298 * local_1c0._12_4_;
    auVar26._16_4_ = fVar300 * local_1c0._16_4_;
    auVar26._20_4_ = fVar238 * local_1c0._20_4_;
    auVar26._24_4_ = fVar247 * local_1c0._24_4_;
    auVar26._28_4_ = auVar23._28_4_;
    auVar21 = vsubps_avx(auVar21,auVar26);
    local_220 = local_1c0._0_4_ + local_220;
    fStack_21c = local_1c0._4_4_ + fStack_21c;
    fStack_218 = local_1c0._8_4_ + fStack_218;
    fStack_214 = local_1c0._12_4_ + fStack_214;
    fStack_210 = local_1c0._16_4_ + fStack_210;
    fStack_20c = local_1c0._20_4_ + fStack_20c;
    fStack_208 = local_1c0._24_4_ + fStack_208;
    fStack_204 = local_1c0._28_4_ + auVar22._28_4_;
    fVar260 = local_1e0._0_4_ + fVar260;
    fVar261 = local_1e0._4_4_ + fVar261;
    fVar266 = local_1e0._8_4_ + fVar266;
    fVar268 = local_1e0._12_4_ + fVar268;
    fVar270 = local_1e0._16_4_ + fVar270;
    fVar279 = local_1e0._20_4_ + fVar279;
    fVar286 = local_1e0._24_4_ + fVar286;
    auVar22._4_4_ = fVar261 * fVar142;
    auVar22._0_4_ = fVar260 * fVar177;
    auVar22._8_4_ = fVar266 * fVar178;
    auVar22._12_4_ = fVar268 * fVar143;
    auVar22._16_4_ = fVar270 * fVar179;
    auVar22._20_4_ = fVar279 * fVar144;
    auVar22._24_4_ = fVar286 * fVar180;
    auVar22._28_4_ = fVar248;
    auVar27._4_4_ = fVar194 * fStack_21c;
    auVar27._0_4_ = fVar193 * local_220;
    auVar27._8_4_ = fVar195 * fStack_218;
    auVar27._12_4_ = fVar298 * fStack_214;
    auVar27._16_4_ = fVar300 * fStack_210;
    auVar27._20_4_ = fVar238 * fStack_20c;
    auVar27._24_4_ = fVar247 * fStack_208;
    auVar27._28_4_ = fStack_204;
    auVar22 = vsubps_avx(auVar22,auVar27);
    auVar28._4_4_ = auVar81._4_4_ * fVar142;
    auVar28._0_4_ = auVar81._0_4_ * fVar177;
    auVar28._8_4_ = auVar81._8_4_ * fVar178;
    auVar28._12_4_ = auVar81._12_4_ * fVar143;
    auVar28._16_4_ = auVar81._16_4_ * fVar179;
    auVar28._20_4_ = auVar81._20_4_ * fVar144;
    auVar28._24_4_ = auVar81._24_4_ * fVar180;
    auVar28._28_4_ = fVar248;
    local_6a0._0_4_ = auVar80._0_4_;
    local_6a0._4_4_ = auVar80._4_4_;
    fStack_698 = auVar80._8_4_;
    fStack_694 = auVar80._12_4_;
    fStack_690 = auVar80._16_4_;
    fStack_68c = auVar80._20_4_;
    fStack_688 = auVar80._24_4_;
    auVar29._4_4_ = fVar194 * (float)local_6a0._4_4_;
    auVar29._0_4_ = fVar193 * (float)local_6a0._0_4_;
    auVar29._8_4_ = fVar195 * fStack_698;
    auVar29._12_4_ = fVar298 * fStack_694;
    auVar29._16_4_ = fVar300 * fStack_690;
    auVar29._20_4_ = fVar238 * fStack_68c;
    auVar29._24_4_ = fVar247 * fStack_688;
    auVar29._28_4_ = 0x40400000;
    auVar26 = vsubps_avx(auVar28,auVar29);
    auVar30._4_4_ = local_200._4_4_ * fVar142;
    auVar30._0_4_ = local_200._0_4_ * fVar177;
    auVar30._8_4_ = local_200._8_4_ * fVar178;
    auVar30._12_4_ = local_200._12_4_ * fVar143;
    auVar30._16_4_ = local_200._16_4_ * fVar179;
    auVar30._20_4_ = local_200._20_4_ * fVar144;
    auVar30._24_4_ = local_200._24_4_ * fVar180;
    auVar30._28_4_ = fVar248;
    auVar31._4_4_ = auVar82._4_4_ * fVar194;
    auVar31._0_4_ = auVar82._0_4_ * fVar193;
    auVar31._8_4_ = auVar82._8_4_ * fVar195;
    auVar31._12_4_ = auVar82._12_4_ * fVar298;
    auVar31._16_4_ = auVar82._16_4_ * fVar300;
    auVar31._20_4_ = auVar82._20_4_ * fVar238;
    auVar31._24_4_ = auVar82._24_4_ * fVar247;
    auVar31._28_4_ = local_200._28_4_;
    auVar27 = vsubps_avx(auVar30,auVar31);
    auVar32._4_4_ = auVar222._4_4_ * fVar142;
    auVar32._0_4_ = auVar222._0_4_ * fVar177;
    auVar32._8_4_ = auVar222._8_4_ * fVar178;
    auVar32._12_4_ = auVar222._12_4_ * fVar143;
    auVar32._16_4_ = auVar222._16_4_ * fVar179;
    auVar32._20_4_ = auVar222._20_4_ * fVar144;
    auVar32._24_4_ = auVar222._24_4_ * fVar180;
    auVar32._28_4_ = fVar248;
    auVar33._4_4_ = fVar194 * auVar209._4_4_;
    auVar33._0_4_ = fVar193 * auVar209._0_4_;
    auVar33._8_4_ = fVar195 * auVar209._8_4_;
    auVar33._12_4_ = fVar298 * auVar209._12_4_;
    auVar33._16_4_ = fVar300 * auVar209._16_4_;
    auVar33._20_4_ = fVar238 * auVar209._20_4_;
    auVar33._24_4_ = fVar247 * auVar209._24_4_;
    auVar33._28_4_ = auVar81._28_4_;
    auVar28 = vsubps_avx(auVar32,auVar33);
    local_240 = auVar209._0_4_ + local_240;
    fStack_23c = auVar209._4_4_ + fStack_23c;
    fStack_238 = auVar209._8_4_ + fStack_238;
    fStack_234 = auVar209._12_4_ + fStack_234;
    fStack_230 = auVar209._16_4_ + fStack_230;
    fStack_22c = auVar209._20_4_ + fStack_22c;
    fStack_228 = auVar209._24_4_ + fStack_228;
    fStack_224 = auVar209._28_4_ + auVar192._28_4_;
    local_260 = auVar222._0_4_ + local_260;
    fStack_25c = auVar222._4_4_ + fStack_25c;
    fStack_258 = auVar222._8_4_ + fStack_258;
    fStack_254 = auVar222._12_4_ + fStack_254;
    fStack_250 = auVar222._16_4_ + local_660;
    fStack_24c = auVar222._20_4_ + fStack_65c;
    fStack_248 = auVar222._24_4_ + fStack_658;
    fStack_244 = auVar222._28_4_ + fStack_654;
    auVar34._4_4_ = fStack_25c * fVar142;
    auVar34._0_4_ = local_260 * fVar177;
    auVar34._8_4_ = fStack_258 * fVar178;
    auVar34._12_4_ = fStack_254 * fVar143;
    auVar34._16_4_ = fStack_250 * fVar179;
    auVar34._20_4_ = fStack_24c * fVar144;
    auVar34._24_4_ = fStack_248 * fVar180;
    auVar34._28_4_ = auVar222._28_4_ + fStack_654;
    auVar35._4_4_ = fStack_23c * fVar194;
    auVar35._0_4_ = local_240 * fVar193;
    auVar35._8_4_ = fStack_238 * fVar195;
    auVar35._12_4_ = fStack_234 * fVar298;
    auVar35._16_4_ = fStack_230 * fVar300;
    auVar35._20_4_ = fStack_22c * fVar238;
    auVar35._24_4_ = fStack_228 * fVar247;
    auVar35._28_4_ = fStack_224;
    auVar29 = vsubps_avx(auVar34,auVar35);
    auVar36._4_4_ = auVar20._4_4_ * fVar142;
    auVar36._0_4_ = auVar20._0_4_ * fVar177;
    auVar36._8_4_ = auVar20._8_4_ * fVar178;
    auVar36._12_4_ = auVar20._12_4_ * fVar143;
    auVar36._16_4_ = auVar20._16_4_ * fVar179;
    auVar36._20_4_ = auVar20._20_4_ * fVar144;
    auVar36._24_4_ = auVar20._24_4_ * fVar180;
    auVar36._28_4_ = fStack_224;
    auVar37._4_4_ = fVar194 * auVar19._4_4_;
    auVar37._0_4_ = fVar193 * auVar19._0_4_;
    auVar37._8_4_ = fVar195 * auVar19._8_4_;
    auVar37._12_4_ = fVar298 * auVar19._12_4_;
    auVar37._16_4_ = fVar300 * auVar19._16_4_;
    auVar37._20_4_ = fVar238 * auVar19._20_4_;
    auVar37._24_4_ = fVar247 * auVar19._24_4_;
    auVar37._28_4_ = auVar19._28_4_;
    auVar30 = vsubps_avx(auVar36,auVar37);
    auVar38._4_4_ = auVar138._4_4_ * fVar142;
    auVar38._0_4_ = auVar138._0_4_ * fVar177;
    auVar38._8_4_ = auVar138._8_4_ * fVar178;
    auVar38._12_4_ = auVar138._12_4_ * fVar143;
    auVar38._16_4_ = auVar138._16_4_ * fVar179;
    auVar38._20_4_ = auVar138._20_4_ * fVar144;
    auVar38._24_4_ = auVar138._24_4_ * fVar180;
    auVar38._28_4_ = auVar25._28_4_ + auVar24._28_4_;
    auVar25._4_4_ = auVar83._4_4_ * fVar194;
    auVar25._0_4_ = auVar83._0_4_ * fVar193;
    auVar25._8_4_ = auVar83._8_4_ * fVar195;
    auVar25._12_4_ = auVar83._12_4_ * fVar298;
    auVar25._16_4_ = auVar83._16_4_ * fVar300;
    auVar25._20_4_ = auVar83._20_4_ * fVar238;
    auVar25._24_4_ = auVar83._24_4_ * fVar247;
    auVar25._28_4_ = fVar248 + auVar158._28_4_;
    auVar25 = vsubps_avx(auVar38,auVar25);
    auVar23 = vminps_avx(auVar21,auVar22);
    auVar80 = vmaxps_avx(auVar21,auVar22);
    auVar21 = vminps_avx(auVar26,auVar27);
    auVar21 = vminps_avx(auVar23,auVar21);
    auVar23 = vmaxps_avx(auVar26,auVar27);
    auVar80 = vmaxps_avx(auVar80,auVar23);
    auVar22 = vminps_avx(auVar28,auVar29);
    auVar23 = vmaxps_avx(auVar28,auVar29);
    auVar24 = vminps_avx(auVar30,auVar25);
    auVar22 = vminps_avx(auVar22,auVar24);
    auVar22 = vminps_avx(auVar21,auVar22);
    auVar21 = vmaxps_avx(auVar30,auVar25);
    auVar23 = vmaxps_avx(auVar23,auVar21);
    auVar23 = vmaxps_avx(auVar80,auVar23);
    auVar80 = vcmpps_avx(auVar22,local_280,2);
    auVar23 = vcmpps_avx(auVar23,local_2a0,5);
    auVar80 = vandps_avx(auVar23,auVar80);
    auVar23 = local_320 & auVar80;
    uVar63 = 0;
    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0x7f,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar23 >> 0xbf,0) != '\0') ||
        (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar23[0x1f] < '\0')
    {
      auVar23 = vsubps_avx(auVar82,local_1c0);
      auVar21 = vsubps_avx(auVar83,auVar209);
      fVar142 = auVar23._0_4_ + auVar21._0_4_;
      fVar178 = auVar23._4_4_ + auVar21._4_4_;
      fVar143 = auVar23._8_4_ + auVar21._8_4_;
      fVar179 = auVar23._12_4_ + auVar21._12_4_;
      fVar144 = auVar23._16_4_ + auVar21._16_4_;
      fVar180 = auVar23._20_4_ + auVar21._20_4_;
      fVar193 = auVar23._24_4_ + auVar21._24_4_;
      auVar22 = vsubps_avx(local_200,local_1e0);
      auVar24 = vsubps_avx(auVar138,auVar222);
      fVar194 = auVar22._0_4_ + auVar24._0_4_;
      fVar195 = auVar22._4_4_ + auVar24._4_4_;
      fVar298 = auVar22._8_4_ + auVar24._8_4_;
      fVar300 = auVar22._12_4_ + auVar24._12_4_;
      fVar238 = auVar22._16_4_ + auVar24._16_4_;
      fVar247 = auVar22._20_4_ + auVar24._20_4_;
      fVar248 = auVar22._24_4_ + auVar24._24_4_;
      fVar177 = auVar24._28_4_;
      auVar39._4_4_ = local_1e0._4_4_ * fVar178;
      auVar39._0_4_ = local_1e0._0_4_ * fVar142;
      auVar39._8_4_ = local_1e0._8_4_ * fVar143;
      auVar39._12_4_ = local_1e0._12_4_ * fVar179;
      auVar39._16_4_ = local_1e0._16_4_ * fVar144;
      auVar39._20_4_ = local_1e0._20_4_ * fVar180;
      auVar39._24_4_ = local_1e0._24_4_ * fVar193;
      auVar39._28_4_ = local_1e0._28_4_;
      auVar40._4_4_ = local_1c0._4_4_ * fVar195;
      auVar40._0_4_ = local_1c0._0_4_ * fVar194;
      auVar40._8_4_ = local_1c0._8_4_ * fVar298;
      auVar40._12_4_ = local_1c0._12_4_ * fVar300;
      auVar40._16_4_ = local_1c0._16_4_ * fVar238;
      auVar40._20_4_ = local_1c0._20_4_ * fVar247;
      auVar40._24_4_ = local_1c0._24_4_ * fVar248;
      auVar40._28_4_ = local_1c0._28_4_;
      auVar24 = vsubps_avx(auVar39,auVar40);
      auVar41._4_4_ = fVar261 * fVar178;
      auVar41._0_4_ = fVar260 * fVar142;
      auVar41._8_4_ = fVar266 * fVar143;
      auVar41._12_4_ = fVar268 * fVar179;
      auVar41._16_4_ = fVar270 * fVar144;
      auVar41._20_4_ = fVar279 * fVar180;
      auVar41._24_4_ = fVar286 * fVar193;
      auVar41._28_4_ = local_1e0._28_4_;
      auVar42._4_4_ = fVar195 * fStack_21c;
      auVar42._0_4_ = fVar194 * local_220;
      auVar42._8_4_ = fVar298 * fStack_218;
      auVar42._12_4_ = fVar300 * fStack_214;
      auVar42._16_4_ = fVar238 * fStack_210;
      auVar42._20_4_ = fVar247 * fStack_20c;
      auVar42._24_4_ = fVar248 * fStack_208;
      auVar42._28_4_ = fVar177;
      auVar25 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = fVar178 * auVar81._4_4_;
      auVar43._0_4_ = fVar142 * auVar81._0_4_;
      auVar43._8_4_ = fVar143 * auVar81._8_4_;
      auVar43._12_4_ = fVar179 * auVar81._12_4_;
      auVar43._16_4_ = fVar144 * auVar81._16_4_;
      auVar43._20_4_ = fVar180 * auVar81._20_4_;
      auVar43._24_4_ = fVar193 * auVar81._24_4_;
      auVar43._28_4_ = fVar177;
      auVar44._4_4_ = fVar195 * (float)local_6a0._4_4_;
      auVar44._0_4_ = fVar194 * (float)local_6a0._0_4_;
      auVar44._8_4_ = fVar298 * fStack_698;
      auVar44._12_4_ = fVar300 * fStack_694;
      auVar44._16_4_ = fVar238 * fStack_690;
      auVar44._20_4_ = fVar247 * fStack_68c;
      auVar44._24_4_ = fVar248 * fStack_688;
      auVar44._28_4_ = local_1e0._28_4_ + auVar157._28_4_;
      auVar81 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = local_200._4_4_ * fVar178;
      auVar45._0_4_ = local_200._0_4_ * fVar142;
      auVar45._8_4_ = local_200._8_4_ * fVar143;
      auVar45._12_4_ = local_200._12_4_ * fVar179;
      auVar45._16_4_ = local_200._16_4_ * fVar144;
      auVar45._20_4_ = local_200._20_4_ * fVar180;
      auVar45._24_4_ = local_200._24_4_ * fVar193;
      auVar45._28_4_ = local_1e0._28_4_ + auVar157._28_4_;
      auVar46._4_4_ = auVar82._4_4_ * fVar195;
      auVar46._0_4_ = auVar82._0_4_ * fVar194;
      auVar46._8_4_ = auVar82._8_4_ * fVar298;
      auVar46._12_4_ = auVar82._12_4_ * fVar300;
      auVar46._16_4_ = auVar82._16_4_ * fVar238;
      auVar46._20_4_ = auVar82._20_4_ * fVar247;
      uVar6 = auVar82._28_4_;
      auVar46._24_4_ = auVar82._24_4_ * fVar248;
      auVar46._28_4_ = uVar6;
      auVar82 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = auVar222._4_4_ * fVar178;
      auVar47._0_4_ = auVar222._0_4_ * fVar142;
      auVar47._8_4_ = auVar222._8_4_ * fVar143;
      auVar47._12_4_ = auVar222._12_4_ * fVar179;
      auVar47._16_4_ = auVar222._16_4_ * fVar144;
      auVar47._20_4_ = auVar222._20_4_ * fVar180;
      auVar47._24_4_ = auVar222._24_4_ * fVar193;
      auVar47._28_4_ = auVar222._28_4_;
      auVar48._4_4_ = auVar209._4_4_ * fVar195;
      auVar48._0_4_ = auVar209._0_4_ * fVar194;
      auVar48._8_4_ = auVar209._8_4_ * fVar298;
      auVar48._12_4_ = auVar209._12_4_ * fVar300;
      auVar48._16_4_ = auVar209._16_4_ * fVar238;
      auVar48._20_4_ = auVar209._20_4_ * fVar247;
      auVar48._24_4_ = auVar209._24_4_ * fVar248;
      auVar48._28_4_ = auVar209._28_4_;
      auVar158 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = fVar178 * fStack_25c;
      auVar49._0_4_ = fVar142 * local_260;
      auVar49._8_4_ = fVar143 * fStack_258;
      auVar49._12_4_ = fVar179 * fStack_254;
      auVar49._16_4_ = fVar144 * fStack_250;
      auVar49._20_4_ = fVar180 * fStack_24c;
      auVar49._24_4_ = fVar193 * fStack_248;
      auVar49._28_4_ = auVar222._28_4_;
      auVar50._4_4_ = fVar195 * fStack_23c;
      auVar50._0_4_ = fVar194 * local_240;
      auVar50._8_4_ = fVar298 * fStack_238;
      auVar50._12_4_ = fVar300 * fStack_234;
      auVar50._16_4_ = fVar238 * fStack_230;
      auVar50._20_4_ = fVar247 * fStack_22c;
      auVar50._24_4_ = fVar248 * fStack_228;
      auVar50._28_4_ = uVar6;
      auVar26 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = fVar178 * auVar20._4_4_;
      auVar51._0_4_ = fVar142 * auVar20._0_4_;
      auVar51._8_4_ = fVar143 * auVar20._8_4_;
      auVar51._12_4_ = fVar179 * auVar20._12_4_;
      auVar51._16_4_ = fVar144 * auVar20._16_4_;
      auVar51._20_4_ = fVar180 * auVar20._20_4_;
      auVar51._24_4_ = fVar193 * auVar20._24_4_;
      auVar51._28_4_ = uVar6;
      auVar52._4_4_ = fVar195 * auVar19._4_4_;
      auVar52._0_4_ = fVar194 * auVar19._0_4_;
      auVar52._8_4_ = fVar298 * auVar19._8_4_;
      auVar52._12_4_ = fVar300 * auVar19._12_4_;
      auVar52._16_4_ = fVar238 * auVar19._16_4_;
      auVar52._20_4_ = fVar247 * auVar19._20_4_;
      auVar52._24_4_ = fVar248 * auVar19._24_4_;
      auVar52._28_4_ = local_200._28_4_;
      auVar19 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = auVar138._4_4_ * fVar178;
      auVar53._0_4_ = auVar138._0_4_ * fVar142;
      auVar53._8_4_ = auVar138._8_4_ * fVar143;
      auVar53._12_4_ = auVar138._12_4_ * fVar179;
      auVar53._16_4_ = auVar138._16_4_ * fVar144;
      auVar53._20_4_ = auVar138._20_4_ * fVar180;
      auVar53._24_4_ = auVar138._24_4_ * fVar193;
      auVar53._28_4_ = auVar23._28_4_ + auVar21._28_4_;
      auVar54._4_4_ = auVar83._4_4_ * fVar195;
      auVar54._0_4_ = auVar83._0_4_ * fVar194;
      auVar54._8_4_ = auVar83._8_4_ * fVar298;
      auVar54._12_4_ = auVar83._12_4_ * fVar300;
      auVar54._16_4_ = auVar83._16_4_ * fVar238;
      auVar54._20_4_ = auVar83._20_4_ * fVar247;
      auVar54._24_4_ = auVar83._24_4_ * fVar248;
      auVar54._28_4_ = auVar22._28_4_ + fVar177;
      auVar83 = vsubps_avx(auVar53,auVar54);
      auVar21 = vminps_avx(auVar24,auVar25);
      auVar23 = vmaxps_avx(auVar24,auVar25);
      auVar22 = vminps_avx(auVar81,auVar82);
      auVar22 = vminps_avx(auVar21,auVar22);
      auVar21 = vmaxps_avx(auVar81,auVar82);
      auVar23 = vmaxps_avx(auVar23,auVar21);
      auVar24 = vminps_avx(auVar158,auVar26);
      auVar21 = vmaxps_avx(auVar158,auVar26);
      auVar81 = vminps_avx(auVar19,auVar83);
      auVar24 = vminps_avx(auVar24,auVar81);
      auVar24 = vminps_avx(auVar22,auVar24);
      auVar22 = vmaxps_avx(auVar19,auVar83);
      auVar21 = vmaxps_avx(auVar21,auVar22);
      auVar21 = vmaxps_avx(auVar23,auVar21);
      auVar23 = vcmpps_avx(auVar24,local_280,2);
      auVar21 = vcmpps_avx(auVar21,local_2a0,5);
      auVar23 = vandps_avx(auVar21,auVar23);
      auVar80 = vandps_avx(auVar80,local_320);
      auVar21 = auVar80 & auVar23;
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar21 >> 0x7f,0) != '\0') ||
            (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar21 >> 0xbf,0) != '\0') ||
          (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar21[0x1f] < '\0') {
        auVar80 = vandps_avx(auVar23,auVar80);
        uVar63 = vmovmskps_avx(auVar80);
      }
    }
    if (uVar63 != 0) {
      auStack_450[uVar70] = uVar63;
      uVar7 = vmovlps_avx(local_3e0);
      *(undefined8 *)(afStack_300 + uVar70 * 2) = uVar7;
      uVar8 = vmovlps_avx(local_700);
      auStack_1a0[uVar70] = uVar8;
      uVar70 = (ulong)((int)uVar70 + 1);
    }
    auVar306 = ZEXT464(0) << 0x20;
    do {
      if ((int)uVar70 == 0) {
        uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar79._4_4_ = uVar6;
        auVar79._0_4_ = uVar6;
        auVar79._8_4_ = uVar6;
        auVar79._12_4_ = uVar6;
        auVar95 = vcmpps_avx(local_440,auVar79,2);
        uVar62 = vmovmskps_avx(auVar95);
        uVar62 = (uint)uVar71 & uVar62;
        if (uVar62 == 0) {
          return;
        }
        goto LAB_00ee4be5;
      }
      uVar66 = (int)uVar70 - 1;
      uVar68 = (ulong)uVar66;
      uVar63 = auStack_450[uVar68];
      fVar177 = afStack_300[uVar68 * 2];
      fVar142 = afStack_300[uVar68 * 2 + 1];
      local_700._8_8_ = 0;
      local_700._0_8_ = auStack_1a0[uVar68];
      uVar8 = 0;
      if (uVar63 != 0) {
        for (; (uVar63 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
        }
      }
      uVar63 = uVar63 - 1 & uVar63;
      auStack_450[uVar68] = uVar63;
      if (uVar63 == 0) {
        uVar70 = (ulong)uVar66;
      }
      fVar143 = (float)(uVar8 + 1) * 0.14285715;
      fVar178 = (1.0 - (float)uVar8 * 0.14285715) * fVar177 + fVar142 * (float)uVar8 * 0.14285715;
      fVar177 = (1.0 - fVar143) * fVar177 + fVar142 * fVar143;
      fVar142 = fVar177 - fVar178;
      if (0.16666667 <= fVar142) break;
      auVar95 = vshufps_avx(local_700,local_700,0x50);
      auVar115._8_4_ = 0x3f800000;
      auVar115._0_8_ = &DAT_3f8000003f800000;
      auVar115._12_4_ = 0x3f800000;
      auVar15 = vsubps_avx(auVar115,auVar95);
      fVar143 = auVar95._0_4_;
      fVar179 = auVar95._4_4_;
      fVar144 = auVar95._8_4_;
      fVar180 = auVar95._12_4_;
      fVar193 = auVar15._0_4_;
      fVar194 = auVar15._4_4_;
      fVar195 = auVar15._8_4_;
      fVar298 = auVar15._12_4_;
      auVar130._0_4_ = auVar240._0_4_ * fVar143 + fVar193 * fVar86;
      auVar130._4_4_ = auVar240._4_4_ * fVar179 + fVar194 * fVar107;
      auVar130._8_4_ = auVar240._0_4_ * fVar144 + fVar195 * fVar86;
      auVar130._12_4_ = auVar240._4_4_ * fVar180 + fVar298 * fVar107;
      auVar149._0_4_ = auVar214._0_4_ * fVar143 + fVar193 * fVar87;
      auVar149._4_4_ = auVar214._4_4_ * fVar179 + fVar194 * fVar108;
      auVar149._8_4_ = auVar214._0_4_ * fVar144 + fVar195 * fVar87;
      auVar149._12_4_ = auVar214._4_4_ * fVar180 + fVar298 * fVar108;
      auVar168._0_4_ = auVar89._0_4_ * fVar143 + auVar281._0_4_ * fVar193;
      auVar168._4_4_ = auVar89._4_4_ * fVar179 + auVar281._4_4_ * fVar194;
      auVar168._8_4_ = auVar89._0_4_ * fVar144 + auVar281._0_4_ * fVar195;
      auVar168._12_4_ = auVar89._4_4_ * fVar180 + auVar281._4_4_ * fVar298;
      auVar91._0_4_ = auVar75._0_4_ * fVar143 + auVar263._0_4_ * fVar193;
      auVar91._4_4_ = auVar75._4_4_ * fVar179 + auVar263._4_4_ * fVar194;
      auVar91._8_4_ = auVar75._0_4_ * fVar144 + auVar263._0_4_ * fVar195;
      auVar91._12_4_ = auVar75._4_4_ * fVar180 + auVar263._4_4_ * fVar298;
      auVar121._16_16_ = auVar130;
      auVar121._0_16_ = auVar130;
      auVar139._16_16_ = auVar149;
      auVar139._0_16_ = auVar149;
      auVar159._16_16_ = auVar168;
      auVar159._0_16_ = auVar168;
      auVar80 = vshufps_avx(ZEXT2032(CONCAT416(fVar177,ZEXT416((uint)fVar178))),
                            ZEXT2032(CONCAT416(fVar177,ZEXT416((uint)fVar178))),0);
      auVar23 = vsubps_avx(auVar139,auVar121);
      fVar143 = auVar80._0_4_;
      fVar179 = auVar80._4_4_;
      fVar144 = auVar80._8_4_;
      fVar180 = auVar80._12_4_;
      fVar193 = auVar80._16_4_;
      fVar194 = auVar80._20_4_;
      fVar195 = auVar80._24_4_;
      auVar122._0_4_ = auVar130._0_4_ + auVar23._0_4_ * fVar143;
      auVar122._4_4_ = auVar130._4_4_ + auVar23._4_4_ * fVar179;
      auVar122._8_4_ = auVar130._8_4_ + auVar23._8_4_ * fVar144;
      auVar122._12_4_ = auVar130._12_4_ + auVar23._12_4_ * fVar180;
      auVar122._16_4_ = auVar130._0_4_ + auVar23._16_4_ * fVar193;
      auVar122._20_4_ = auVar130._4_4_ + auVar23._20_4_ * fVar194;
      auVar122._24_4_ = auVar130._8_4_ + auVar23._24_4_ * fVar195;
      auVar122._28_4_ = auVar130._12_4_ + auVar23._28_4_;
      auVar23 = vsubps_avx(auVar159,auVar139);
      auVar140._0_4_ = auVar149._0_4_ + auVar23._0_4_ * fVar143;
      auVar140._4_4_ = auVar149._4_4_ + auVar23._4_4_ * fVar179;
      auVar140._8_4_ = auVar149._8_4_ + auVar23._8_4_ * fVar144;
      auVar140._12_4_ = auVar149._12_4_ + auVar23._12_4_ * fVar180;
      auVar140._16_4_ = auVar149._0_4_ + auVar23._16_4_ * fVar193;
      auVar140._20_4_ = auVar149._4_4_ + auVar23._20_4_ * fVar194;
      auVar140._24_4_ = auVar149._8_4_ + auVar23._24_4_ * fVar195;
      auVar140._28_4_ = auVar149._12_4_ + auVar23._28_4_;
      auVar95 = vsubps_avx(auVar91,auVar168);
      auVar104._0_4_ = auVar168._0_4_ + auVar95._0_4_ * fVar143;
      auVar104._4_4_ = auVar168._4_4_ + auVar95._4_4_ * fVar179;
      auVar104._8_4_ = auVar168._8_4_ + auVar95._8_4_ * fVar144;
      auVar104._12_4_ = auVar168._12_4_ + auVar95._12_4_ * fVar180;
      auVar104._16_4_ = auVar168._0_4_ + auVar95._0_4_ * fVar193;
      auVar104._20_4_ = auVar168._4_4_ + auVar95._4_4_ * fVar194;
      auVar104._24_4_ = auVar168._8_4_ + auVar95._8_4_ * fVar195;
      auVar104._28_4_ = auVar168._12_4_ + auVar95._12_4_;
      auVar23 = vsubps_avx(auVar140,auVar122);
      auVar123._0_4_ = auVar122._0_4_ + fVar143 * auVar23._0_4_;
      auVar123._4_4_ = auVar122._4_4_ + fVar179 * auVar23._4_4_;
      auVar123._8_4_ = auVar122._8_4_ + fVar144 * auVar23._8_4_;
      auVar123._12_4_ = auVar122._12_4_ + fVar180 * auVar23._12_4_;
      auVar123._16_4_ = auVar122._16_4_ + fVar193 * auVar23._16_4_;
      auVar123._20_4_ = auVar122._20_4_ + fVar194 * auVar23._20_4_;
      auVar123._24_4_ = auVar122._24_4_ + fVar195 * auVar23._24_4_;
      auVar123._28_4_ = auVar122._28_4_ + auVar23._28_4_;
      auVar23 = vsubps_avx(auVar104,auVar140);
      auVar105._0_4_ = auVar140._0_4_ + fVar143 * auVar23._0_4_;
      auVar105._4_4_ = auVar140._4_4_ + fVar179 * auVar23._4_4_;
      auVar105._8_4_ = auVar140._8_4_ + fVar144 * auVar23._8_4_;
      auVar105._12_4_ = auVar140._12_4_ + fVar180 * auVar23._12_4_;
      auVar105._16_4_ = auVar140._16_4_ + fVar193 * auVar23._16_4_;
      auVar105._20_4_ = auVar140._20_4_ + fVar194 * auVar23._20_4_;
      auVar105._24_4_ = auVar140._24_4_ + fVar195 * auVar23._24_4_;
      auVar105._28_4_ = auVar140._28_4_ + auVar23._28_4_;
      auVar23 = vsubps_avx(auVar105,auVar123);
      auVar131._0_4_ = auVar123._0_4_ + fVar143 * auVar23._0_4_;
      auVar131._4_4_ = auVar123._4_4_ + fVar179 * auVar23._4_4_;
      auVar131._8_4_ = auVar123._8_4_ + fVar144 * auVar23._8_4_;
      auVar131._12_4_ = auVar123._12_4_ + fVar180 * auVar23._12_4_;
      auVar141._16_4_ = auVar123._16_4_ + fVar193 * auVar23._16_4_;
      auVar141._0_16_ = auVar131;
      auVar141._20_4_ = auVar123._20_4_ + fVar194 * auVar23._20_4_;
      auVar141._24_4_ = auVar123._24_4_ + fVar195 * auVar23._24_4_;
      auVar141._28_4_ = auVar123._28_4_ + auVar140._28_4_;
      fVar143 = auVar23._4_4_ * 3.0;
      auVar116 = auVar141._16_16_;
      auVar94 = vshufps_avx(ZEXT416((uint)(fVar142 * 0.33333334)),
                            ZEXT416((uint)(fVar142 * 0.33333334)),0);
      auVar229._0_4_ = auVar131._0_4_ + auVar94._0_4_ * auVar23._0_4_ * 3.0;
      auVar229._4_4_ = auVar131._4_4_ + auVar94._4_4_ * fVar143;
      auVar229._8_4_ = auVar131._8_4_ + auVar94._8_4_ * auVar23._8_4_ * 3.0;
      auVar229._12_4_ = auVar131._12_4_ + auVar94._12_4_ * auVar23._12_4_ * 3.0;
      auVar175 = vshufpd_avx(auVar131,auVar131,3);
      auVar74 = vshufpd_avx(auVar116,auVar116,3);
      auVar95 = vsubps_avx(auVar175,auVar131);
      auVar15 = vsubps_avx(auVar74,auVar116);
      auVar92._0_4_ = auVar95._0_4_ + auVar15._0_4_;
      auVar92._4_4_ = auVar95._4_4_ + auVar15._4_4_;
      auVar92._8_4_ = auVar95._8_4_ + auVar15._8_4_;
      auVar92._12_4_ = auVar95._12_4_ + auVar15._12_4_;
      auVar95 = vmovshdup_avx(auVar131);
      auVar15 = vmovshdup_avx(auVar229);
      auVar72 = vshufps_avx(auVar92,auVar92,0);
      auVar77 = vshufps_avx(auVar92,auVar92,0x55);
      fVar194 = auVar77._0_4_;
      fVar195 = auVar77._4_4_;
      fVar298 = auVar77._8_4_;
      fVar300 = auVar77._12_4_;
      fVar179 = auVar72._0_4_;
      fVar144 = auVar72._4_4_;
      fVar180 = auVar72._8_4_;
      fVar193 = auVar72._12_4_;
      auVar215._0_4_ = fVar179 * auVar131._0_4_ + fVar194 * auVar95._0_4_;
      auVar215._4_4_ = fVar144 * auVar131._4_4_ + fVar195 * auVar95._4_4_;
      auVar215._8_4_ = fVar180 * auVar131._8_4_ + fVar298 * auVar95._8_4_;
      auVar215._12_4_ = fVar193 * auVar131._12_4_ + fVar300 * auVar95._12_4_;
      auVar230._0_4_ = auVar229._0_4_ * fVar179 + fVar194 * auVar15._0_4_;
      auVar230._4_4_ = auVar229._4_4_ * fVar144 + fVar195 * auVar15._4_4_;
      auVar230._8_4_ = auVar229._8_4_ * fVar180 + fVar298 * auVar15._8_4_;
      auVar230._12_4_ = auVar229._12_4_ * fVar193 + fVar300 * auVar15._12_4_;
      auVar15 = vshufps_avx(auVar215,auVar215,0xe8);
      auVar72 = vshufps_avx(auVar230,auVar230,0xe8);
      auVar95 = vcmpps_avx(auVar15,auVar72,1);
      uVar63 = vextractps_avx(auVar95,0);
      auVar77 = auVar230;
      if ((uVar63 & 1) == 0) {
        auVar77 = auVar215;
      }
      auVar93._0_4_ = auVar94._0_4_ * auVar23._16_4_ * 3.0;
      auVar93._4_4_ = auVar94._4_4_ * fVar143;
      auVar93._8_4_ = auVar94._8_4_ * auVar23._24_4_ * 3.0;
      auVar93._12_4_ = auVar94._12_4_ * auVar80._28_4_;
      auVar110 = vsubps_avx(auVar116,auVar93);
      auVar94 = vmovshdup_avx(auVar110);
      auVar116 = vmovshdup_avx(auVar116);
      fVar143 = auVar110._0_4_;
      fVar238 = auVar110._4_4_;
      auVar303._0_4_ = fVar179 * fVar143 + fVar194 * auVar94._0_4_;
      auVar303._4_4_ = fVar144 * fVar238 + fVar195 * auVar94._4_4_;
      auVar303._8_4_ = fVar180 * auVar110._8_4_ + fVar298 * auVar94._8_4_;
      auVar303._12_4_ = fVar193 * auVar110._12_4_ + fVar300 * auVar94._12_4_;
      auVar282._0_4_ = fVar179 * auVar141._16_4_ + fVar194 * auVar116._0_4_;
      auVar282._4_4_ = fVar144 * auVar141._20_4_ + fVar195 * auVar116._4_4_;
      auVar282._8_4_ = fVar180 * auVar141._24_4_ + fVar298 * auVar116._8_4_;
      auVar282._12_4_ = fVar193 * auVar141._28_4_ + fVar300 * auVar116._12_4_;
      auVar116 = vshufps_avx(auVar303,auVar303,0xe8);
      auVar109 = vshufps_avx(auVar282,auVar282,0xe8);
      auVar94 = vcmpps_avx(auVar116,auVar109,1);
      uVar63 = vextractps_avx(auVar94,0);
      auVar111 = auVar282;
      if ((uVar63 & 1) == 0) {
        auVar111 = auVar303;
      }
      auVar77 = vmaxss_avx(auVar111,auVar77);
      auVar15 = vminps_avx(auVar15,auVar72);
      auVar72 = vminps_avx(auVar116,auVar109);
      auVar72 = vminps_avx(auVar15,auVar72);
      auVar95 = vshufps_avx(auVar95,auVar95,0x55);
      auVar95 = vblendps_avx(auVar95,auVar94,2);
      auVar94 = vpslld_avx(auVar95,0x1f);
      auVar95 = vshufpd_avx(auVar230,auVar230,1);
      auVar95 = vinsertps_avx(auVar95,auVar282,0x9c);
      auVar15 = vshufpd_avx(auVar215,auVar215,1);
      auVar15 = vinsertps_avx(auVar15,auVar303,0x9c);
      auVar95 = vblendvps_avx(auVar15,auVar95,auVar94);
      auVar15 = vmovshdup_avx(auVar95);
      auVar95 = vmaxss_avx(auVar15,auVar95);
      fVar180 = auVar72._0_4_;
      auVar15 = vmovshdup_avx(auVar72);
      fVar144 = auVar95._0_4_;
      fVar193 = auVar15._0_4_;
      fVar179 = auVar77._0_4_;
      if ((0.0001 <= fVar180) || (fVar144 <= -0.0001)) {
        if ((-0.0001 < fVar179 && fVar193 < 0.0001) ||
           ((fVar180 < 0.0001 && -0.0001 < fVar179 || (fVar193 < 0.0001 && -0.0001 < fVar144))))
        goto LAB_00ee5e3f;
LAB_00ee68d5:
        bVar55 = true;
        auVar306 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
LAB_00ee5e3f:
        auVar306 = ZEXT464(0) << 0x20;
        auVar94 = vcmpps_avx(auVar72,ZEXT416(0) << 0x20,1);
        auVar15 = vcmpss_avx(auVar77,ZEXT416(0),1);
        auVar293._8_4_ = 0x3f800000;
        auVar293._0_8_ = &DAT_3f8000003f800000;
        auVar293._12_4_ = 0x3f800000;
        auVar169._8_4_ = 0xbf800000;
        auVar169._0_8_ = 0xbf800000bf800000;
        auVar169._12_4_ = 0xbf800000;
        auVar15 = vblendvps_avx(auVar293,auVar169,auVar15);
        auVar94 = vblendvps_avx(auVar293,auVar169,auVar94);
        auVar116 = vcmpss_avx(auVar15,auVar94,4);
        auVar116 = vpshufd_avx(ZEXT416(auVar116._0_4_ & 1),0x50);
        auVar116 = vpslld_avx(auVar116,0x1f);
        auVar116 = vpsrad_avx(auVar116,0x1f);
        auVar116 = vpandn_avx(auVar116,_DAT_02020eb0);
        auVar109 = vmovshdup_avx(auVar94);
        fVar194 = auVar109._0_4_;
        if ((auVar94._0_4_ != fVar194) || (NAN(auVar94._0_4_) || NAN(fVar194))) {
          if ((fVar193 != fVar180) || (NAN(fVar193) || NAN(fVar180))) {
            fVar180 = -fVar180 / (fVar193 - fVar180);
            auVar94 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar180) * 0.0 + fVar180)));
          }
          else {
            auVar94 = vcmpss_avx(auVar72,ZEXT416(0),0);
            auVar94 = vpshufd_avx(ZEXT416(auVar94._0_4_ & 1),0x50);
            auVar94 = vpslld_avx(auVar94,0x1f);
            auVar94 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar94);
          }
          auVar109 = vcmpps_avx(auVar116,auVar94,1);
          auVar72 = vblendps_avx(auVar116,auVar94,2);
          auVar94 = vblendps_avx(auVar94,auVar116,2);
          auVar116 = vblendvps_avx(auVar94,auVar72,auVar109);
        }
        auVar95 = vcmpss_avx(auVar95,ZEXT416(0),1);
        auVar117._8_4_ = 0xbf800000;
        auVar117._0_8_ = 0xbf800000bf800000;
        auVar117._12_4_ = 0xbf800000;
        auVar95 = vblendvps_avx(auVar293,auVar117,auVar95);
        fVar180 = auVar95._0_4_;
        if ((auVar15._0_4_ != fVar180) || (NAN(auVar15._0_4_) || NAN(fVar180))) {
          if ((fVar144 != fVar179) || (NAN(fVar144) || NAN(fVar179))) {
            fVar179 = -fVar179 / (fVar144 - fVar179);
            auVar95 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar179) * 0.0 + fVar179)));
          }
          else {
            auVar95 = vcmpss_avx(auVar77,ZEXT416(0),0);
            auVar95 = vpshufd_avx(ZEXT416(auVar95._0_4_ & 1),0x50);
            auVar95 = vpslld_avx(auVar95,0x1f);
            auVar95 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar95);
          }
          auVar94 = vcmpps_avx(auVar116,auVar95,1);
          auVar15 = vblendps_avx(auVar116,auVar95,2);
          auVar95 = vblendps_avx(auVar95,auVar116,2);
          auVar116 = vblendvps_avx(auVar95,auVar15,auVar94);
        }
        if ((fVar194 != fVar180) || (NAN(fVar194) || NAN(fVar180))) {
          auVar95 = vcmpps_avx(auVar116,auVar293,1);
          auVar15 = vinsertps_avx(auVar116,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar170._4_12_ = auVar116._4_12_;
          auVar170._0_4_ = 0x3f800000;
          auVar116 = vblendvps_avx(auVar170,auVar15,auVar95);
        }
        auVar95 = vcmpps_avx(auVar116,_DAT_01fec6f0,1);
        auVar56._12_4_ = 0;
        auVar56._0_12_ = auVar116._4_12_;
        auVar15 = vinsertps_avx(auVar116,ZEXT416(0x3f800000),0x10);
        auVar95 = vblendvps_avx(auVar15,auVar56 << 0x20,auVar95);
        auVar15 = vmovshdup_avx(auVar95);
        bVar55 = true;
        if (auVar95._0_4_ <= auVar15._0_4_) {
          auVar96._0_4_ = auVar95._0_4_ + -0.1;
          auVar96._4_4_ = auVar95._4_4_ + 0.1;
          auVar96._8_4_ = auVar95._8_4_ + 0.0;
          auVar96._12_4_ = auVar95._12_4_ + 0.0;
          auVar94 = vshufpd_avx(auVar229,auVar229,3);
          auVar132._8_8_ = 0x3f80000000000000;
          auVar132._0_8_ = 0x3f80000000000000;
          auVar95 = vcmpps_avx(auVar96,auVar132,1);
          auVar57._12_4_ = 0;
          auVar57._0_12_ = auVar96._4_12_;
          auVar15 = vinsertps_avx(auVar96,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar95 = vblendvps_avx(auVar15,auVar57 << 0x20,auVar95);
          auVar15 = vshufpd_avx(auVar110,auVar110,3);
          auVar72 = vshufps_avx(auVar95,auVar95,0x50);
          auVar77 = vsubps_avx(auVar293,auVar72);
          local_640 = auVar175._0_4_;
          fStack_63c = auVar175._4_4_;
          fStack_638 = auVar175._8_4_;
          fStack_634 = auVar175._12_4_;
          fVar179 = auVar72._0_4_;
          fVar144 = auVar72._4_4_;
          fVar180 = auVar72._8_4_;
          fVar193 = auVar72._12_4_;
          local_6c0 = auVar74._0_4_;
          fStack_6bc = auVar74._4_4_;
          fStack_6b8 = auVar74._8_4_;
          fStack_6b4 = auVar74._12_4_;
          fVar194 = auVar77._0_4_;
          fVar195 = auVar77._4_4_;
          fVar298 = auVar77._8_4_;
          fVar300 = auVar77._12_4_;
          auVar118._0_4_ = fVar179 * local_640 + fVar194 * auVar131._0_4_;
          auVar118._4_4_ = fVar144 * fStack_63c + fVar195 * auVar131._4_4_;
          auVar118._8_4_ = fVar180 * fStack_638 + fVar298 * auVar131._0_4_;
          auVar118._12_4_ = fVar193 * fStack_634 + fVar300 * auVar131._4_4_;
          auVar150._0_4_ = fVar179 * auVar94._0_4_ + fVar194 * auVar229._0_4_;
          auVar150._4_4_ = fVar144 * auVar94._4_4_ + fVar195 * auVar229._4_4_;
          auVar150._8_4_ = fVar180 * auVar94._8_4_ + fVar298 * auVar229._0_4_;
          auVar150._12_4_ = fVar193 * auVar94._12_4_ + fVar300 * auVar229._4_4_;
          auVar206._0_4_ = fVar179 * auVar15._0_4_ + fVar194 * fVar143;
          auVar206._4_4_ = fVar144 * auVar15._4_4_ + fVar195 * fVar238;
          auVar206._8_4_ = fVar180 * auVar15._8_4_ + fVar298 * fVar143;
          auVar206._12_4_ = fVar193 * auVar15._12_4_ + fVar300 * fVar238;
          auVar216._0_4_ = fVar179 * local_6c0 + fVar194 * auVar141._16_4_;
          auVar216._4_4_ = fVar144 * fStack_6bc + fVar195 * auVar141._20_4_;
          auVar216._8_4_ = fVar180 * fStack_6b8 + fVar298 * auVar141._16_4_;
          auVar216._12_4_ = fVar193 * fStack_6b4 + fVar300 * auVar141._20_4_;
          auVar74 = vsubps_avx(auVar293,auVar95);
          auVar15 = vmovshdup_avx(local_700);
          auVar175 = vmovsldup_avx(local_700);
          local_700._0_4_ = auVar74._0_4_ * auVar175._0_4_ + auVar15._0_4_ * auVar95._0_4_;
          local_700._4_4_ = auVar74._4_4_ * auVar175._4_4_ + auVar15._4_4_ * auVar95._4_4_;
          local_700._8_4_ = auVar74._8_4_ * auVar175._8_4_ + auVar15._8_4_ * auVar95._8_4_;
          local_700._12_4_ = auVar74._12_4_ * auVar175._12_4_ + auVar15._12_4_ * auVar95._12_4_;
          auVar110 = vmovshdup_avx(local_700);
          auVar95 = vsubps_avx(auVar150,auVar118);
          auVar171._0_4_ = auVar95._0_4_ * 3.0;
          auVar171._4_4_ = auVar95._4_4_ * 3.0;
          auVar171._8_4_ = auVar95._8_4_ * 3.0;
          auVar171._12_4_ = auVar95._12_4_ * 3.0;
          auVar95 = vsubps_avx(auVar206,auVar150);
          auVar187._0_4_ = auVar95._0_4_ * 3.0;
          auVar187._4_4_ = auVar95._4_4_ * 3.0;
          auVar187._8_4_ = auVar95._8_4_ * 3.0;
          auVar187._12_4_ = auVar95._12_4_ * 3.0;
          auVar95 = vsubps_avx(auVar216,auVar206);
          auVar231._0_4_ = auVar95._0_4_ * 3.0;
          auVar231._4_4_ = auVar95._4_4_ * 3.0;
          auVar231._8_4_ = auVar95._8_4_ * 3.0;
          auVar231._12_4_ = auVar95._12_4_ * 3.0;
          auVar15 = vminps_avx(auVar187,auVar231);
          auVar95 = vmaxps_avx(auVar187,auVar231);
          auVar15 = vminps_avx(auVar171,auVar15);
          auVar95 = vmaxps_avx(auVar171,auVar95);
          auVar175 = vshufpd_avx(auVar15,auVar15,3);
          auVar74 = vshufpd_avx(auVar95,auVar95,3);
          auVar15 = vminps_avx(auVar15,auVar175);
          auVar95 = vmaxps_avx(auVar95,auVar74);
          auVar175 = vshufps_avx(ZEXT416((uint)(1.0 / fVar142)),ZEXT416((uint)(1.0 / fVar142)),0);
          auVar172._0_4_ = auVar175._0_4_ * auVar15._0_4_;
          auVar172._4_4_ = auVar175._4_4_ * auVar15._4_4_;
          auVar172._8_4_ = auVar175._8_4_ * auVar15._8_4_;
          auVar172._12_4_ = auVar175._12_4_ * auVar15._12_4_;
          auVar188._0_4_ = auVar95._0_4_ * auVar175._0_4_;
          auVar188._4_4_ = auVar95._4_4_ * auVar175._4_4_;
          auVar188._8_4_ = auVar95._8_4_ * auVar175._8_4_;
          auVar188._12_4_ = auVar95._12_4_ * auVar175._12_4_;
          auVar77 = ZEXT416((uint)(1.0 / (auVar110._0_4_ - local_700._0_4_)));
          auVar95 = vshufpd_avx(auVar118,auVar118,3);
          auVar15 = vshufpd_avx(auVar150,auVar150,3);
          auVar175 = vshufpd_avx(auVar206,auVar206,3);
          auVar74 = vshufpd_avx(auVar216,auVar216,3);
          auVar95 = vsubps_avx(auVar95,auVar118);
          auVar94 = vsubps_avx(auVar15,auVar150);
          auVar72 = vsubps_avx(auVar175,auVar206);
          auVar74 = vsubps_avx(auVar74,auVar216);
          auVar15 = vminps_avx(auVar95,auVar94);
          auVar95 = vmaxps_avx(auVar95,auVar94);
          auVar175 = vminps_avx(auVar72,auVar74);
          auVar175 = vminps_avx(auVar15,auVar175);
          auVar15 = vmaxps_avx(auVar72,auVar74);
          auVar95 = vmaxps_avx(auVar95,auVar15);
          auVar15 = vshufps_avx(auVar77,auVar77,0);
          auVar241._0_4_ = auVar15._0_4_ * auVar175._0_4_;
          auVar241._4_4_ = auVar15._4_4_ * auVar175._4_4_;
          auVar241._8_4_ = auVar15._8_4_ * auVar175._8_4_;
          auVar241._12_4_ = auVar15._12_4_ * auVar175._12_4_;
          auVar253._0_4_ = auVar15._0_4_ * auVar95._0_4_;
          auVar253._4_4_ = auVar15._4_4_ * auVar95._4_4_;
          auVar253._8_4_ = auVar15._8_4_ * auVar95._8_4_;
          auVar253._12_4_ = auVar15._12_4_ * auVar95._12_4_;
          auVar95 = vmovsldup_avx(local_700);
          auVar207._4_12_ = auVar95._4_12_;
          auVar207._0_4_ = fVar178;
          auVar217._4_12_ = local_700._4_12_;
          auVar217._0_4_ = fVar177;
          auVar78._0_4_ = (fVar177 + fVar178) * 0.5;
          auVar78._4_4_ = (local_700._4_4_ + auVar95._4_4_) * 0.5;
          auVar78._8_4_ = (local_700._8_4_ + auVar95._8_4_) * 0.5;
          auVar78._12_4_ = (local_700._12_4_ + auVar95._12_4_) * 0.5;
          auVar95 = vshufps_avx(auVar78,auVar78,0);
          fVar143 = auVar95._0_4_;
          fVar179 = auVar95._4_4_;
          fVar144 = auVar95._8_4_;
          fVar180 = auVar95._12_4_;
          local_550 = auVar16._0_4_;
          fStack_54c = auVar16._4_4_;
          fStack_548 = auVar16._8_4_;
          fStack_544 = auVar16._12_4_;
          auVar151._0_4_ = fVar143 * (float)local_330._0_4_ + local_550;
          auVar151._4_4_ = fVar179 * (float)local_330._4_4_ + fStack_54c;
          auVar151._8_4_ = fVar144 * fStack_328 + fStack_548;
          auVar151._12_4_ = fVar180 * fStack_324 + fStack_544;
          local_560 = auVar17._0_4_;
          fStack_55c = auVar17._4_4_;
          fStack_558 = auVar17._8_4_;
          fStack_554 = auVar17._12_4_;
          auVar232._0_4_ = fVar143 * (float)local_340._0_4_ + local_560;
          auVar232._4_4_ = fVar179 * (float)local_340._4_4_ + fStack_55c;
          auVar232._8_4_ = fVar144 * fStack_338 + fStack_558;
          auVar232._12_4_ = fVar180 * fStack_334 + fStack_554;
          local_570 = auVar18._0_4_;
          fStack_56c = auVar18._4_4_;
          fStack_568 = auVar18._8_4_;
          fStack_564 = auVar18._12_4_;
          auVar264._0_4_ = fVar143 * (float)local_350._0_4_ + local_570;
          auVar264._4_4_ = fVar179 * (float)local_350._4_4_ + fStack_56c;
          auVar264._8_4_ = fVar144 * fStack_348 + fStack_568;
          auVar264._12_4_ = fVar180 * fStack_344 + fStack_564;
          auVar95 = vsubps_avx(auVar232,auVar151);
          auVar152._0_4_ = auVar95._0_4_ * fVar143 + auVar151._0_4_;
          auVar152._4_4_ = auVar95._4_4_ * fVar179 + auVar151._4_4_;
          auVar152._8_4_ = auVar95._8_4_ * fVar144 + auVar151._8_4_;
          auVar152._12_4_ = auVar95._12_4_ * fVar180 + auVar151._12_4_;
          auVar95 = vsubps_avx(auVar264,auVar232);
          auVar233._0_4_ = auVar232._0_4_ + auVar95._0_4_ * fVar143;
          auVar233._4_4_ = auVar232._4_4_ + auVar95._4_4_ * fVar179;
          auVar233._8_4_ = auVar232._8_4_ + auVar95._8_4_ * fVar144;
          auVar233._12_4_ = auVar232._12_4_ + auVar95._12_4_ * fVar180;
          auVar95 = vsubps_avx(auVar233,auVar152);
          fVar143 = auVar152._0_4_ + auVar95._0_4_ * fVar143;
          fVar179 = auVar152._4_4_ + auVar95._4_4_ * fVar179;
          auVar119._0_8_ = CONCAT44(fVar179,fVar143);
          auVar119._8_4_ = auVar152._8_4_ + auVar95._8_4_ * fVar144;
          auVar119._12_4_ = auVar152._12_4_ + auVar95._12_4_ * fVar180;
          fVar144 = auVar95._0_4_ * 3.0;
          fVar180 = auVar95._4_4_ * 3.0;
          auVar153._0_8_ = CONCAT44(fVar180,fVar144);
          auVar153._8_4_ = auVar95._8_4_ * 3.0;
          auVar153._12_4_ = auVar95._12_4_ * 3.0;
          auVar234._8_8_ = auVar119._0_8_;
          auVar234._0_8_ = auVar119._0_8_;
          auVar95 = vshufpd_avx(auVar119,auVar119,3);
          auVar15 = vshufps_avx(auVar78,auVar78,0x55);
          auVar72 = vsubps_avx(auVar95,auVar234);
          auVar235._0_4_ = auVar15._0_4_ * auVar72._0_4_ + fVar143;
          auVar235._4_4_ = auVar15._4_4_ * auVar72._4_4_ + fVar179;
          auVar235._8_4_ = auVar15._8_4_ * auVar72._8_4_ + fVar143;
          auVar235._12_4_ = auVar15._12_4_ * auVar72._12_4_ + fVar179;
          auVar283._8_8_ = auVar153._0_8_;
          auVar283._0_8_ = auVar153._0_8_;
          auVar95 = vshufpd_avx(auVar153,auVar153,1);
          auVar95 = vsubps_avx(auVar95,auVar283);
          auVar154._0_4_ = fVar144 + auVar15._0_4_ * auVar95._0_4_;
          auVar154._4_4_ = fVar180 + auVar15._4_4_ * auVar95._4_4_;
          auVar154._8_4_ = fVar144 + auVar15._8_4_ * auVar95._8_4_;
          auVar154._12_4_ = fVar180 + auVar15._12_4_ * auVar95._12_4_;
          auVar15 = vmovshdup_avx(auVar154);
          auVar284._0_8_ = auVar15._0_8_ ^ 0x8000000080000000;
          auVar284._8_4_ = auVar15._8_4_ ^ 0x80000000;
          auVar284._12_4_ = auVar15._12_4_ ^ 0x80000000;
          auVar175 = vmovshdup_avx(auVar72);
          auVar95 = vunpcklps_avx(auVar175,auVar284);
          auVar74 = vshufps_avx(auVar95,auVar284,4);
          auVar120._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
          auVar120._8_4_ = -auVar72._8_4_;
          auVar120._12_4_ = -auVar72._12_4_;
          auVar95 = vmovlhps_avx(auVar120,auVar154);
          auVar94 = vshufps_avx(auVar95,auVar154,8);
          auVar95 = ZEXT416((uint)(auVar175._0_4_ * auVar154._0_4_ - auVar15._0_4_ * auVar72._0_4_))
          ;
          auVar15 = vshufps_avx(auVar95,auVar95,0);
          auVar95 = vdivps_avx(auVar74,auVar15);
          auVar15 = vdivps_avx(auVar94,auVar15);
          auVar94 = vinsertps_avx(auVar172,auVar241,0x1c);
          auVar72 = vinsertps_avx(auVar188,auVar253,0x1c);
          auVar77 = vinsertps_avx(auVar241,auVar172,0x4c);
          auVar116 = vinsertps_avx(auVar253,auVar188,0x4c);
          auVar175 = vmovsldup_avx(auVar95);
          auVar254._0_4_ = auVar175._0_4_ * auVar94._0_4_;
          auVar254._4_4_ = auVar175._4_4_ * auVar94._4_4_;
          auVar254._8_4_ = auVar175._8_4_ * auVar94._8_4_;
          auVar254._12_4_ = auVar175._12_4_ * auVar94._12_4_;
          auVar242._0_4_ = auVar175._0_4_ * auVar72._0_4_;
          auVar242._4_4_ = auVar175._4_4_ * auVar72._4_4_;
          auVar242._8_4_ = auVar175._8_4_ * auVar72._8_4_;
          auVar242._12_4_ = auVar175._12_4_ * auVar72._12_4_;
          auVar74 = vminps_avx(auVar254,auVar242);
          auVar175 = vmaxps_avx(auVar242,auVar254);
          auVar109 = vmovsldup_avx(auVar15);
          auVar304._0_4_ = auVar109._0_4_ * auVar77._0_4_;
          auVar304._4_4_ = auVar109._4_4_ * auVar77._4_4_;
          auVar304._8_4_ = auVar109._8_4_ * auVar77._8_4_;
          auVar304._12_4_ = auVar109._12_4_ * auVar77._12_4_;
          auVar243._0_4_ = auVar109._0_4_ * auVar116._0_4_;
          auVar243._4_4_ = auVar109._4_4_ * auVar116._4_4_;
          auVar243._8_4_ = auVar109._8_4_ * auVar116._8_4_;
          auVar243._12_4_ = auVar109._12_4_ * auVar116._12_4_;
          auVar109 = vminps_avx(auVar304,auVar243);
          auVar97._0_4_ = auVar74._0_4_ + auVar109._0_4_;
          auVar97._4_4_ = auVar74._4_4_ + auVar109._4_4_;
          auVar97._8_4_ = auVar74._8_4_ + auVar109._8_4_;
          auVar97._12_4_ = auVar74._12_4_ + auVar109._12_4_;
          auVar74 = vmaxps_avx(auVar243,auVar304);
          auVar109 = vsubps_avx(auVar207,auVar78);
          auVar111 = vsubps_avx(auVar217,auVar78);
          auVar218._0_4_ = auVar175._0_4_ + auVar74._0_4_;
          auVar218._4_4_ = auVar175._4_4_ + auVar74._4_4_;
          auVar218._8_4_ = auVar175._8_4_ + auVar74._8_4_;
          auVar218._12_4_ = auVar175._12_4_ + auVar74._12_4_;
          auVar255._8_8_ = 0x3f800000;
          auVar255._0_8_ = 0x3f800000;
          auVar175 = vsubps_avx(auVar255,auVar218);
          auVar74 = vsubps_avx(auVar255,auVar97);
          fVar195 = auVar109._0_4_;
          auVar256._0_4_ = fVar195 * auVar175._0_4_;
          fVar298 = auVar109._4_4_;
          auVar256._4_4_ = fVar298 * auVar175._4_4_;
          fVar300 = auVar109._8_4_;
          auVar256._8_4_ = fVar300 * auVar175._8_4_;
          fVar238 = auVar109._12_4_;
          auVar256._12_4_ = fVar238 * auVar175._12_4_;
          fVar144 = auVar111._0_4_;
          auVar219._0_4_ = auVar175._0_4_ * fVar144;
          fVar180 = auVar111._4_4_;
          auVar219._4_4_ = auVar175._4_4_ * fVar180;
          fVar193 = auVar111._8_4_;
          auVar219._8_4_ = auVar175._8_4_ * fVar193;
          fVar194 = auVar111._12_4_;
          auVar219._12_4_ = auVar175._12_4_ * fVar194;
          auVar294._0_4_ = fVar195 * auVar74._0_4_;
          auVar294._4_4_ = fVar298 * auVar74._4_4_;
          auVar294._8_4_ = fVar300 * auVar74._8_4_;
          auVar294._12_4_ = fVar238 * auVar74._12_4_;
          auVar98._0_4_ = fVar144 * auVar74._0_4_;
          auVar98._4_4_ = fVar180 * auVar74._4_4_;
          auVar98._8_4_ = fVar193 * auVar74._8_4_;
          auVar98._12_4_ = fVar194 * auVar74._12_4_;
          auVar175 = vminps_avx(auVar256,auVar294);
          auVar74 = vminps_avx(auVar219,auVar98);
          auVar109 = vminps_avx(auVar175,auVar74);
          auVar175 = vmaxps_avx(auVar294,auVar256);
          auVar74 = vmaxps_avx(auVar98,auVar219);
          auVar111 = vshufps_avx(auVar78,auVar78,0x54);
          auVar74 = vmaxps_avx(auVar74,auVar175);
          auVar125 = vshufps_avx(auVar235,auVar235,0);
          auVar126 = vshufps_avx(auVar235,auVar235,0x55);
          auVar175 = vhaddps_avx(auVar109,auVar109);
          auVar74 = vhaddps_avx(auVar74,auVar74);
          auVar220._0_4_ = auVar125._0_4_ * auVar95._0_4_ + auVar126._0_4_ * auVar15._0_4_;
          auVar220._4_4_ = auVar125._4_4_ * auVar95._4_4_ + auVar126._4_4_ * auVar15._4_4_;
          auVar220._8_4_ = auVar125._8_4_ * auVar95._8_4_ + auVar126._8_4_ * auVar15._8_4_;
          auVar220._12_4_ = auVar125._12_4_ * auVar95._12_4_ + auVar126._12_4_ * auVar15._12_4_;
          auVar109 = vsubps_avx(auVar111,auVar220);
          fVar143 = auVar109._0_4_ + auVar175._0_4_;
          fVar179 = auVar109._0_4_ + auVar74._0_4_;
          auVar175 = vmaxss_avx(ZEXT416((uint)fVar178),ZEXT416((uint)fVar143));
          auVar74 = vminss_avx(ZEXT416((uint)fVar179),ZEXT416((uint)fVar177));
          if (auVar175._0_4_ <= auVar74._0_4_) {
            auVar175 = vmovshdup_avx(auVar95);
            auVar133._0_4_ = auVar94._0_4_ * auVar175._0_4_;
            auVar133._4_4_ = auVar94._4_4_ * auVar175._4_4_;
            auVar133._8_4_ = auVar94._8_4_ * auVar175._8_4_;
            auVar133._12_4_ = auVar94._12_4_ * auVar175._12_4_;
            auVar99._0_4_ = auVar72._0_4_ * auVar175._0_4_;
            auVar99._4_4_ = auVar72._4_4_ * auVar175._4_4_;
            auVar99._8_4_ = auVar72._8_4_ * auVar175._8_4_;
            auVar99._12_4_ = auVar72._12_4_ * auVar175._12_4_;
            auVar74 = vminps_avx(auVar133,auVar99);
            auVar175 = vmaxps_avx(auVar99,auVar133);
            auVar94 = vmovshdup_avx(auVar15);
            auVar173._0_4_ = auVar94._0_4_ * auVar77._0_4_;
            auVar173._4_4_ = auVar94._4_4_ * auVar77._4_4_;
            auVar173._8_4_ = auVar94._8_4_ * auVar77._8_4_;
            auVar173._12_4_ = auVar94._12_4_ * auVar77._12_4_;
            auVar134._0_4_ = auVar94._0_4_ * auVar116._0_4_;
            auVar134._4_4_ = auVar94._4_4_ * auVar116._4_4_;
            auVar134._8_4_ = auVar94._8_4_ * auVar116._8_4_;
            auVar134._12_4_ = auVar94._12_4_ * auVar116._12_4_;
            auVar94 = vminps_avx(auVar173,auVar134);
            auVar189._0_4_ = auVar74._0_4_ + auVar94._0_4_;
            auVar189._4_4_ = auVar74._4_4_ + auVar94._4_4_;
            auVar189._8_4_ = auVar74._8_4_ + auVar94._8_4_;
            auVar189._12_4_ = auVar74._12_4_ + auVar94._12_4_;
            auVar74 = vmaxps_avx(auVar134,auVar173);
            auVar100._0_4_ = auVar175._0_4_ + auVar74._0_4_;
            auVar100._4_4_ = auVar175._4_4_ + auVar74._4_4_;
            auVar100._8_4_ = auVar175._8_4_ + auVar74._8_4_;
            auVar100._12_4_ = auVar175._12_4_ + auVar74._12_4_;
            auVar175 = vsubps_avx(auVar132,auVar100);
            auVar74 = vsubps_avx(auVar132,auVar189);
            auVar174._0_4_ = fVar195 * auVar175._0_4_;
            auVar174._4_4_ = fVar298 * auVar175._4_4_;
            auVar174._8_4_ = fVar300 * auVar175._8_4_;
            auVar174._12_4_ = fVar238 * auVar175._12_4_;
            auVar190._0_4_ = fVar195 * auVar74._0_4_;
            auVar190._4_4_ = fVar298 * auVar74._4_4_;
            auVar190._8_4_ = fVar300 * auVar74._8_4_;
            auVar190._12_4_ = fVar238 * auVar74._12_4_;
            auVar101._0_4_ = fVar144 * auVar175._0_4_;
            auVar101._4_4_ = fVar180 * auVar175._4_4_;
            auVar101._8_4_ = fVar193 * auVar175._8_4_;
            auVar101._12_4_ = fVar194 * auVar175._12_4_;
            auVar135._0_4_ = fVar144 * auVar74._0_4_;
            auVar135._4_4_ = fVar180 * auVar74._4_4_;
            auVar135._8_4_ = fVar193 * auVar74._8_4_;
            auVar135._12_4_ = fVar194 * auVar74._12_4_;
            auVar175 = vminps_avx(auVar174,auVar190);
            auVar74 = vminps_avx(auVar101,auVar135);
            auVar175 = vminps_avx(auVar175,auVar74);
            auVar74 = vmaxps_avx(auVar190,auVar174);
            auVar94 = vmaxps_avx(auVar135,auVar101);
            auVar175 = vhaddps_avx(auVar175,auVar175);
            auVar74 = vmaxps_avx(auVar94,auVar74);
            auVar74 = vhaddps_avx(auVar74,auVar74);
            auVar94 = vmovshdup_avx(auVar109);
            auVar72 = ZEXT416((uint)(auVar94._0_4_ + auVar175._0_4_));
            auVar175 = vmaxss_avx(local_700,auVar72);
            auVar94 = ZEXT416((uint)(auVar94._0_4_ + auVar74._0_4_));
            auVar74 = vminss_avx(auVar94,auVar110);
            auVar244._8_4_ = 0x7fffffff;
            auVar244._0_8_ = 0x7fffffff7fffffff;
            auVar244._12_4_ = 0x7fffffff;
            if (auVar175._0_4_ <= auVar74._0_4_) {
              uVar63 = 0;
              auVar295._8_4_ = 0x3f800000;
              auVar295._0_8_ = &DAT_3f8000003f800000;
              auVar295._12_4_ = 0x3f800000;
              auVar306 = ZEXT864(0) << 0x20;
              if ((fVar178 < fVar143) && (uVar63 = 0, fVar179 < fVar177)) {
                auVar175 = vcmpps_avx(auVar94,auVar110,1);
                auVar74 = vcmpps_avx(local_700,auVar72,1);
                auVar175 = vandps_avx(auVar74,auVar175);
                uVar63 = auVar175._0_4_;
              }
              if (((uint)uVar70 < 4 && 0.001 <= fVar142) && (uVar63 & 1) == 0) {
                bVar55 = false;
              }
              else {
                lVar65 = 200;
                do {
                  fVar143 = auVar109._0_4_;
                  fVar142 = 1.0 - fVar143;
                  auVar175 = ZEXT416((uint)(fVar142 * fVar142 * fVar142));
                  auVar175 = vshufps_avx(auVar175,auVar175,0);
                  auVar74 = ZEXT416((uint)(fVar143 * 3.0 * fVar142 * fVar142));
                  auVar74 = vshufps_avx(auVar74,auVar74,0);
                  auVar94 = ZEXT416((uint)(fVar142 * fVar143 * fVar143 * 3.0));
                  auVar94 = vshufps_avx(auVar94,auVar94,0);
                  auVar72 = ZEXT416((uint)(fVar143 * fVar143 * fVar143));
                  auVar72 = vshufps_avx(auVar72,auVar72,0);
                  local_680._0_4_ = auVar73._0_4_;
                  local_680._4_4_ = auVar73._4_4_;
                  fStack_678 = auVar73._8_4_;
                  fStack_674 = auVar73._12_4_;
                  fVar142 = local_550 * auVar175._0_4_ +
                            local_560 * auVar74._0_4_ +
                            auVar72._0_4_ * (float)local_680._0_4_ + local_570 * auVar94._0_4_;
                  fVar143 = fStack_54c * auVar175._4_4_ +
                            fStack_55c * auVar74._4_4_ +
                            auVar72._4_4_ * (float)local_680._4_4_ + fStack_56c * auVar94._4_4_;
                  auVar102._0_8_ = CONCAT44(fVar143,fVar142);
                  auVar102._8_4_ =
                       fStack_548 * auVar175._8_4_ +
                       fStack_558 * auVar74._8_4_ +
                       auVar72._8_4_ * fStack_678 + fStack_568 * auVar94._8_4_;
                  auVar102._12_4_ =
                       fStack_544 * auVar175._12_4_ +
                       fStack_554 * auVar74._12_4_ +
                       auVar72._12_4_ * fStack_674 + fStack_564 * auVar94._12_4_;
                  auVar136._8_8_ = auVar102._0_8_;
                  auVar136._0_8_ = auVar102._0_8_;
                  auVar74 = vshufpd_avx(auVar102,auVar102,1);
                  auVar175 = vmovshdup_avx(auVar109);
                  auVar74 = vsubps_avx(auVar74,auVar136);
                  auVar103._0_4_ = auVar175._0_4_ * auVar74._0_4_ + fVar142;
                  auVar103._4_4_ = auVar175._4_4_ * auVar74._4_4_ + fVar143;
                  auVar103._8_4_ = auVar175._8_4_ * auVar74._8_4_ + fVar142;
                  auVar103._12_4_ = auVar175._12_4_ * auVar74._12_4_ + fVar143;
                  auVar175 = vshufps_avx(auVar103,auVar103,0);
                  auVar74 = vshufps_avx(auVar103,auVar103,0x55);
                  auVar137._0_4_ = auVar95._0_4_ * auVar175._0_4_ + auVar15._0_4_ * auVar74._0_4_;
                  auVar137._4_4_ = auVar95._4_4_ * auVar175._4_4_ + auVar15._4_4_ * auVar74._4_4_;
                  auVar137._8_4_ = auVar95._8_4_ * auVar175._8_4_ + auVar15._8_4_ * auVar74._8_4_;
                  auVar137._12_4_ =
                       auVar95._12_4_ * auVar175._12_4_ + auVar15._12_4_ * auVar74._12_4_;
                  auVar109 = vsubps_avx(auVar109,auVar137);
                  auVar175 = vandps_avx(auVar244,auVar103);
                  auVar74 = vshufps_avx(auVar175,auVar175,0xf5);
                  auVar175 = vmaxss_avx(auVar74,auVar175);
                  if (auVar175._0_4_ < fVar124) {
                    fVar142 = auVar109._0_4_;
                    if ((0.0 <= fVar142) && (fVar142 <= 1.0)) {
                      auVar95 = vmovshdup_avx(auVar109);
                      fVar143 = auVar95._0_4_;
                      if ((0.0 <= fVar143) && (fVar143 <= 1.0)) {
                        auVar95 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                                ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                                0x1c);
                        auVar116 = vinsertps_avx(auVar95,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                       m128[2]),0x28);
                        auVar95 = vdpps_avx(auVar116,local_360,0x7f);
                        auVar15 = vdpps_avx(auVar116,local_370,0x7f);
                        auVar175 = vdpps_avx(auVar116,local_380,0x7f);
                        auVar74 = vdpps_avx(auVar116,local_390,0x7f);
                        auVar94 = vdpps_avx(auVar116,local_3a0,0x7f);
                        auVar72 = vdpps_avx(auVar116,local_3b0,0x7f);
                        auVar77 = vdpps_avx(auVar116,local_3c0,0x7f);
                        auVar116 = vdpps_avx(auVar116,local_3d0,0x7f);
                        fVar194 = 1.0 - fVar143;
                        fVar195 = 1.0 - fVar142;
                        fVar179 = auVar109._4_4_;
                        fVar144 = auVar109._8_4_;
                        fVar180 = auVar109._12_4_;
                        fVar193 = fVar195 * fVar142 * fVar142 * 3.0;
                        auVar208._0_4_ = fVar142 * fVar142 * fVar142;
                        auVar208._4_4_ = fVar179 * fVar179 * fVar179;
                        auVar208._8_4_ = fVar144 * fVar144 * fVar144;
                        auVar208._12_4_ = fVar180 * fVar180 * fVar180;
                        fVar144 = fVar195 * fVar195 * fVar142 * 3.0;
                        fVar180 = fVar195 * fVar195 * fVar195;
                        fVar179 = fVar180 * (fVar194 * auVar95._0_4_ + fVar143 * auVar94._0_4_) +
                                  (fVar194 * auVar15._0_4_ + auVar72._0_4_ * fVar143) * fVar144 +
                                  fVar193 * (auVar77._0_4_ * fVar143 + fVar194 * auVar175._0_4_) +
                                  auVar208._0_4_ *
                                  (fVar194 * auVar74._0_4_ + fVar143 * auVar116._0_4_);
                        if (((fVar160 <= fVar179) &&
                            (fVar194 = *(float *)(ray + k * 4 + 0x100), fVar179 <= fVar194)) &&
                           (pGVar10 = (context->scene->geometries).items[uVar62].ptr,
                           (pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) != 0)) {
                          auStack_f0 = vshufps_avx(auVar109,auVar109,0x55);
                          auVar95 = vsubps_avx(auVar295,auStack_f0);
                          fVar298 = auStack_f0._0_4_;
                          fVar300 = auStack_f0._4_4_;
                          fVar238 = auStack_f0._8_4_;
                          fVar247 = auStack_f0._12_4_;
                          fVar248 = auVar95._0_4_;
                          fVar249 = auVar95._4_4_;
                          fVar250 = auVar95._8_4_;
                          fVar258 = auVar95._12_4_;
                          auVar245._0_4_ =
                               fVar298 * (float)local_470._0_4_ + fVar248 * (float)local_460._0_4_;
                          auVar245._4_4_ =
                               fVar300 * (float)local_470._4_4_ + fVar249 * (float)local_460._4_4_;
                          auVar245._8_4_ = fVar238 * fStack_468 + fVar250 * fStack_458;
                          auVar245._12_4_ = fVar247 * fStack_464 + fVar258 * fStack_454;
                          auVar257._0_4_ =
                               fVar298 * (float)local_4c0._0_4_ + fVar248 * (float)local_4a0._0_4_;
                          auVar257._4_4_ =
                               fVar300 * (float)local_4c0._4_4_ + fVar249 * (float)local_4a0._4_4_;
                          auVar257._8_4_ = fVar238 * fStack_4b8 + fVar250 * fStack_498;
                          auVar257._12_4_ = fVar247 * fStack_4b4 + fVar258 * fStack_494;
                          auVar265._0_4_ =
                               fVar298 * (float)local_3f0._0_4_ + fVar248 * (float)local_4b0._0_4_;
                          auVar265._4_4_ =
                               fVar300 * (float)local_3f0._4_4_ + fVar249 * (float)local_4b0._4_4_;
                          auVar265._8_4_ = fVar238 * fStack_3e8 + fVar250 * fStack_4a8;
                          auVar265._12_4_ = fVar247 * fStack_3e4 + fVar258 * fStack_4a4;
                          auVar236._0_4_ =
                               fVar298 * (float)local_490._0_4_ + fVar248 * (float)local_480._0_4_;
                          auVar236._4_4_ =
                               fVar300 * (float)local_490._4_4_ + fVar249 * (float)local_480._4_4_;
                          auVar236._8_4_ = fVar238 * fStack_488 + fVar250 * fStack_478;
                          auVar236._12_4_ = fVar247 * fStack_484 + fVar258 * fStack_474;
                          auVar74 = vsubps_avx(auVar257,auVar245);
                          auVar94 = vsubps_avx(auVar265,auVar257);
                          auVar72 = vsubps_avx(auVar236,auVar265);
                          auStack_110 = vshufps_avx(auVar109,auVar109,0);
                          fVar247 = auStack_110._0_4_;
                          fVar248 = auStack_110._4_4_;
                          fVar249 = auStack_110._8_4_;
                          fVar250 = auStack_110._12_4_;
                          auVar95 = vshufps_avx(ZEXT416((uint)fVar195),ZEXT416((uint)fVar195),0);
                          fVar195 = auVar95._0_4_;
                          fVar298 = auVar95._4_4_;
                          fVar300 = auVar95._8_4_;
                          fVar238 = auVar95._12_4_;
                          auVar95 = vshufps_avx(auVar208,auVar208,0);
                          auVar15 = vshufps_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193),0);
                          auVar175 = vshufps_avx(ZEXT416((uint)fVar144),ZEXT416((uint)fVar144),0);
                          auVar191._0_4_ =
                               (fVar195 * (fVar195 * auVar74._0_4_ + fVar247 * auVar94._0_4_) +
                               fVar247 * (fVar195 * auVar94._0_4_ + fVar247 * auVar72._0_4_)) * 3.0;
                          auVar191._4_4_ =
                               (fVar298 * (fVar298 * auVar74._4_4_ + fVar248 * auVar94._4_4_) +
                               fVar248 * (fVar298 * auVar94._4_4_ + fVar248 * auVar72._4_4_)) * 3.0;
                          auVar191._8_4_ =
                               (fVar300 * (fVar300 * auVar74._8_4_ + fVar249 * auVar94._8_4_) +
                               fVar249 * (fVar300 * auVar94._8_4_ + fVar249 * auVar72._8_4_)) * 3.0;
                          auVar191._12_4_ =
                               (fVar238 * (fVar238 * auVar74._12_4_ + fVar250 * auVar94._12_4_) +
                               fVar250 * (fVar238 * auVar94._12_4_ + fVar250 * auVar72._12_4_)) *
                               3.0;
                          auVar74 = vshufps_avx(ZEXT416((uint)fVar180),ZEXT416((uint)fVar180),0);
                          auVar155._0_4_ =
                               auVar74._0_4_ * (float)local_400._0_4_ +
                               auVar175._0_4_ * (float)local_410._0_4_ +
                               auVar95._0_4_ * (float)local_430._0_4_ +
                               auVar15._0_4_ * (float)local_420._0_4_;
                          auVar155._4_4_ =
                               auVar74._4_4_ * (float)local_400._4_4_ +
                               auVar175._4_4_ * (float)local_410._4_4_ +
                               auVar95._4_4_ * (float)local_430._4_4_ +
                               auVar15._4_4_ * (float)local_420._4_4_;
                          auVar155._8_4_ =
                               auVar74._8_4_ * fStack_3f8 +
                               auVar175._8_4_ * fStack_408 +
                               auVar95._8_4_ * fStack_428 + auVar15._8_4_ * fStack_418;
                          auVar155._12_4_ =
                               auVar74._12_4_ * fStack_3f4 +
                               auVar175._12_4_ * fStack_404 +
                               auVar95._12_4_ * fStack_424 + auVar15._12_4_ * fStack_414;
                          auVar95 = vshufps_avx(auVar191,auVar191,0xc9);
                          auVar176._0_4_ = auVar155._0_4_ * auVar95._0_4_;
                          auVar176._4_4_ = auVar155._4_4_ * auVar95._4_4_;
                          auVar176._8_4_ = auVar155._8_4_ * auVar95._8_4_;
                          auVar176._12_4_ = auVar155._12_4_ * auVar95._12_4_;
                          auVar95 = vshufps_avx(auVar155,auVar155,0xc9);
                          auVar156._0_4_ = auVar191._0_4_ * auVar95._0_4_;
                          auVar156._4_4_ = auVar191._4_4_ * auVar95._4_4_;
                          auVar156._8_4_ = auVar191._8_4_ * auVar95._8_4_;
                          auVar156._12_4_ = auVar191._12_4_ * auVar95._12_4_;
                          auVar95 = vsubps_avx(auVar156,auVar176);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x100) = fVar179;
                            uVar6 = vextractps_avx(auVar95,1);
                            *(undefined4 *)(ray + k * 4 + 0x180) = uVar6;
                            uVar6 = vextractps_avx(auVar95,2);
                            *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar6;
                            *(int *)(ray + k * 4 + 0x1c0) = auVar95._0_4_;
                            *(float *)(ray + k * 4 + 0x1e0) = fVar142;
                            *(float *)(ray + k * 4 + 0x200) = fVar143;
                            *(uint *)(ray + k * 4 + 0x220) = uVar69;
                            *(uint *)(ray + k * 4 + 0x240) = uVar62;
                            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                          }
                          else {
                            auStack_170 = vshufps_avx(auVar95,auVar95,0x55);
                            auStack_150 = vshufps_avx(auVar95,auVar95,0xaa);
                            auStack_130 = vshufps_avx(auVar95,auVar95,0);
                            local_180[0] = (RTCHitN)auStack_170[0];
                            local_180[1] = (RTCHitN)auStack_170[1];
                            local_180[2] = (RTCHitN)auStack_170[2];
                            local_180[3] = (RTCHitN)auStack_170[3];
                            local_180[4] = (RTCHitN)auStack_170[4];
                            local_180[5] = (RTCHitN)auStack_170[5];
                            local_180[6] = (RTCHitN)auStack_170[6];
                            local_180[7] = (RTCHitN)auStack_170[7];
                            local_180[8] = (RTCHitN)auStack_170[8];
                            local_180[9] = (RTCHitN)auStack_170[9];
                            local_180[10] = (RTCHitN)auStack_170[10];
                            local_180[0xb] = (RTCHitN)auStack_170[0xb];
                            local_180[0xc] = (RTCHitN)auStack_170[0xc];
                            local_180[0xd] = (RTCHitN)auStack_170[0xd];
                            local_180[0xe] = (RTCHitN)auStack_170[0xe];
                            local_180[0xf] = (RTCHitN)auStack_170[0xf];
                            local_160 = auStack_150;
                            local_140 = auStack_130;
                            local_120 = auStack_110;
                            local_100 = auStack_f0;
                            local_e0 = local_2e0._0_8_;
                            uStack_d8 = local_2e0._8_8_;
                            uStack_d0 = local_2e0._16_8_;
                            uStack_c8 = local_2e0._24_8_;
                            local_c0 = local_2c0._0_8_;
                            uStack_b8 = local_2c0._8_8_;
                            uStack_b0 = local_2c0._16_8_;
                            uStack_a8 = local_2c0._24_8_;
                            auVar80 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                            uStack_9c = context->user->instID[0];
                            local_a0 = uStack_9c;
                            uStack_98 = uStack_9c;
                            uStack_94 = uStack_9c;
                            uStack_90 = uStack_9c;
                            uStack_8c = uStack_9c;
                            uStack_84 = auVar80._28_4_;
                            uVar63 = uStack_84;
                            uStack_88 = uStack_9c;
                            uStack_84 = uStack_9c;
                            uStack_7c = context->user->instPrimID[0];
                            local_80 = uStack_7c;
                            uStack_78 = uStack_7c;
                            uStack_74 = uStack_7c;
                            uStack_70 = uStack_7c;
                            uStack_6c = uStack_7c;
                            uStack_68 = uStack_7c;
                            uStack_64 = uStack_7c;
                            *(float *)(ray + k * 4 + 0x100) = fVar179;
                            local_520 = *(undefined8 *)(mm_lookupmask_ps + uVar64);
                            uStack_518 = *(undefined8 *)(mm_lookupmask_ps + uVar64 + 8);
                            local_510 = *(undefined8 *)(mm_lookupmask_ps + lVar67);
                            uStack_508 = *(undefined8 *)(mm_lookupmask_ps + lVar67 + 8);
                            local_4f0.valid = (int *)&local_520;
                            local_4f0.geometryUserPtr = pGVar10->userPtr;
                            local_4f0.context = context->user;
                            local_4f0.hit = local_180;
                            local_4f0.N = 8;
                            local_4f0.ray = (RTCRayN *)ray;
                            if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar10->intersectionFilterN)(&local_4f0);
                              auVar306 = ZEXT1664(ZEXT816(0) << 0x40);
                            }
                            auVar58._8_8_ = uStack_518;
                            auVar58._0_8_ = local_520;
                            auVar95 = vpcmpeqd_avx(auVar306._0_16_,auVar58);
                            auVar60._8_8_ = uStack_508;
                            auVar60._0_8_ = local_510;
                            auVar15 = vpcmpeqd_avx(auVar306._0_16_,auVar60);
                            auVar84._16_16_ = auVar15;
                            auVar84._0_16_ = auVar95;
                            auVar23 = auVar80 & ~auVar84;
                            if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar23 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar23 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar23 >> 0x7f,0) == '\0') &&
                                  (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                                  ) && SUB321(auVar23 >> 0xbf,0) == '\0') &&
                                (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar23[0x1f]) {
                              auVar85._0_4_ = auVar95._0_4_ ^ auVar80._0_4_;
                              auVar85._4_4_ = auVar95._4_4_ ^ auVar80._4_4_;
                              auVar85._8_4_ = auVar95._8_4_ ^ auVar80._8_4_;
                              auVar85._12_4_ = auVar95._12_4_ ^ auVar80._12_4_;
                              auVar85._16_4_ = auVar15._0_4_ ^ auVar80._16_4_;
                              auVar85._20_4_ = auVar15._4_4_ ^ auVar80._20_4_;
                              auVar85._24_4_ = auVar15._8_4_ ^ auVar80._24_4_;
                              auVar85._28_4_ = auVar15._12_4_ ^ uVar63;
                            }
                            else {
                              p_Var11 = context->args->filter;
                              if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var11)(&local_4f0);
                                auVar306 = ZEXT1664(ZEXT816(0) << 0x40);
                              }
                              auVar59._8_8_ = uStack_518;
                              auVar59._0_8_ = local_520;
                              auVar95 = vpcmpeqd_avx(auVar306._0_16_,auVar59);
                              auVar61._8_8_ = uStack_508;
                              auVar61._0_8_ = local_510;
                              auVar15 = vpcmpeqd_avx(auVar306._0_16_,auVar61);
                              auVar106._16_16_ = auVar15;
                              auVar106._0_16_ = auVar95;
                              auVar85._0_4_ = auVar95._0_4_ ^ auVar80._0_4_;
                              auVar85._4_4_ = auVar95._4_4_ ^ auVar80._4_4_;
                              auVar85._8_4_ = auVar95._8_4_ ^ auVar80._8_4_;
                              auVar85._12_4_ = auVar95._12_4_ ^ auVar80._12_4_;
                              auVar85._16_4_ = auVar15._0_4_ ^ auVar80._16_4_;
                              auVar85._20_4_ = auVar15._4_4_ ^ auVar80._20_4_;
                              auVar85._24_4_ = auVar15._8_4_ ^ auVar80._24_4_;
                              auVar85._28_4_ = auVar15._12_4_ ^ uVar63;
                              auVar80 = auVar80 & ~auVar106;
                              if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar80 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar80 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar80 >> 0x7f,0) != '\0')
                                    || (auVar80 & (undefined1  [32])0x100000000) !=
                                       (undefined1  [32])0x0) || SUB321(auVar80 >> 0xbf,0) != '\0')
                                  || (auVar80 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0) || auVar80[0x1f] < '\0') {
                                auVar80 = vmaskmovps_avx(auVar85,*(undefined1 (*) [32])local_4f0.hit
                                                        );
                                *(undefined1 (*) [32])(local_4f0.ray + 0x180) = auVar80;
                                auVar80 = vmaskmovps_avx(auVar85,*(undefined1 (*) [32])
                                                                  (local_4f0.hit + 0x20));
                                *(undefined1 (*) [32])(local_4f0.ray + 0x1a0) = auVar80;
                                auVar80 = vmaskmovps_avx(auVar85,*(undefined1 (*) [32])
                                                                  (local_4f0.hit + 0x40));
                                *(undefined1 (*) [32])(local_4f0.ray + 0x1c0) = auVar80;
                                auVar80 = vmaskmovps_avx(auVar85,*(undefined1 (*) [32])
                                                                  (local_4f0.hit + 0x60));
                                *(undefined1 (*) [32])(local_4f0.ray + 0x1e0) = auVar80;
                                auVar80 = vmaskmovps_avx(auVar85,*(undefined1 (*) [32])
                                                                  (local_4f0.hit + 0x80));
                                *(undefined1 (*) [32])(local_4f0.ray + 0x200) = auVar80;
                                auVar80 = vmaskmovps_avx(auVar85,*(undefined1 (*) [32])
                                                                  (local_4f0.hit + 0xa0));
                                *(undefined1 (*) [32])(local_4f0.ray + 0x220) = auVar80;
                                auVar80 = vmaskmovps_avx(auVar85,*(undefined1 (*) [32])
                                                                  (local_4f0.hit + 0xc0));
                                *(undefined1 (*) [32])(local_4f0.ray + 0x240) = auVar80;
                                auVar80 = vmaskmovps_avx(auVar85,*(undefined1 (*) [32])
                                                                  (local_4f0.hit + 0xe0));
                                *(undefined1 (*) [32])(local_4f0.ray + 0x260) = auVar80;
                                auVar80 = vmaskmovps_avx(auVar85,*(undefined1 (*) [32])
                                                                  (local_4f0.hit + 0x100));
                                *(undefined1 (*) [32])(local_4f0.ray + 0x280) = auVar80;
                              }
                            }
                            if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar85 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar85 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar85 >> 0x7f,0) == '\0') &&
                                  (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                                  ) && SUB321(auVar85 >> 0xbf,0) == '\0') &&
                                (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar85[0x1f]) {
                              *(float *)(ray + k * 4 + 0x100) = fVar194;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar65 = lVar65 + -1;
                } while (lVar65 != 0);
              }
              goto LAB_00ee68bf;
            }
          }
          goto LAB_00ee68d5;
        }
      }
LAB_00ee68bf:
    } while (bVar55);
    local_620 = ZEXT416((uint)fVar178);
    local_3e0 = vinsertps_avx(local_620,ZEXT416((uint)fVar177),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }